

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  code *pcVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  long lVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [28];
  undefined1 auVar91 [28];
  byte bVar92;
  uint uVar93;
  ulong uVar94;
  uint uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  long lVar99;
  undefined4 uVar100;
  undefined8 uVar101;
  float fVar115;
  vint4 bi_2;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar114;
  float fVar116;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar120;
  undefined8 uVar121;
  vint4 bi_1;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar137;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar125 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  float fVar138;
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar149 [32];
  undefined1 auVar143 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar153;
  float fVar160;
  vint4 ai_2;
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  vint4 ai;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 bi;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [64];
  vint4 ai_1;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar191 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined4 uVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_840 [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined1 local_740 [16];
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar190 [16];
  
  PVar8 = prim[1];
  uVar98 = (ulong)(byte)PVar8;
  lVar75 = uVar98 * 0x19;
  fVar139 = *(float *)(prim + lVar75 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar13 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + lVar75 + 6));
  auVar102._0_4_ = fVar139 * auVar13._0_4_;
  auVar102._4_4_ = fVar139 * auVar13._4_4_;
  auVar102._8_4_ = fVar139 * auVar13._8_4_;
  auVar102._12_4_ = fVar139 * auVar13._12_4_;
  auVar168._0_4_ = fVar139 * auVar14._0_4_;
  auVar168._4_4_ = fVar139 * auVar14._4_4_;
  auVar168._8_4_ = fVar139 * auVar14._8_4_;
  auVar168._12_4_ = fVar139 * auVar14._12_4_;
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 5 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar98 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar94 = (ulong)(uint)((int)(uVar98 * 9) * 2);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar98 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  uVar94 = (ulong)(uint)((int)(uVar98 * 5) << 2);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar212._4_4_ = auVar168._0_4_;
  auVar212._0_4_ = auVar168._0_4_;
  auVar212._8_4_ = auVar168._0_4_;
  auVar212._12_4_ = auVar168._0_4_;
  auVar123 = vshufps_avx(auVar168,auVar168,0x55);
  auVar103 = vshufps_avx(auVar168,auVar168,0xaa);
  fVar139 = auVar103._0_4_;
  auVar200._0_4_ = fVar139 * auVar15._0_4_;
  fVar138 = auVar103._4_4_;
  auVar200._4_4_ = fVar138 * auVar15._4_4_;
  fVar114 = auVar103._8_4_;
  auVar200._8_4_ = fVar114 * auVar15._8_4_;
  fVar115 = auVar103._12_4_;
  auVar200._12_4_ = fVar115 * auVar15._12_4_;
  auVar198._0_4_ = auVar18._0_4_ * fVar139;
  auVar198._4_4_ = auVar18._4_4_ * fVar138;
  auVar198._8_4_ = auVar18._8_4_ * fVar114;
  auVar198._12_4_ = auVar18._12_4_ * fVar115;
  auVar185._0_4_ = auVar140._0_4_ * fVar139;
  auVar185._4_4_ = auVar140._4_4_ * fVar138;
  auVar185._8_4_ = auVar140._8_4_ * fVar114;
  auVar185._12_4_ = auVar140._12_4_ * fVar115;
  auVar103 = vfmadd231ps_fma(auVar200,auVar123,auVar14);
  auVar124 = vfmadd231ps_fma(auVar198,auVar123,auVar17);
  auVar123 = vfmadd231ps_fma(auVar185,auVar104,auVar123);
  auVar154 = vfmadd231ps_fma(auVar103,auVar212,auVar13);
  auVar205 = ZEXT1664(auVar154);
  auVar124 = vfmadd231ps_fma(auVar124,auVar212,auVar16);
  auVar162 = vfmadd231ps_fma(auVar123,auVar105,auVar212);
  auVar213._4_4_ = auVar102._0_4_;
  auVar213._0_4_ = auVar102._0_4_;
  auVar213._8_4_ = auVar102._0_4_;
  auVar213._12_4_ = auVar102._0_4_;
  auVar123 = vshufps_avx(auVar102,auVar102,0x55);
  auVar103 = vshufps_avx(auVar102,auVar102,0xaa);
  fVar139 = auVar103._0_4_;
  auVar169._0_4_ = fVar139 * auVar15._0_4_;
  fVar138 = auVar103._4_4_;
  auVar169._4_4_ = fVar138 * auVar15._4_4_;
  fVar114 = auVar103._8_4_;
  auVar169._8_4_ = fVar114 * auVar15._8_4_;
  fVar115 = auVar103._12_4_;
  auVar169._12_4_ = fVar115 * auVar15._12_4_;
  auVar122._0_4_ = auVar18._0_4_ * fVar139;
  auVar122._4_4_ = auVar18._4_4_ * fVar138;
  auVar122._8_4_ = auVar18._8_4_ * fVar114;
  auVar122._12_4_ = auVar18._12_4_ * fVar115;
  auVar103._0_4_ = auVar140._0_4_ * fVar139;
  auVar103._4_4_ = auVar140._4_4_ * fVar138;
  auVar103._8_4_ = auVar140._8_4_ * fVar114;
  auVar103._12_4_ = auVar140._12_4_ * fVar115;
  auVar14 = vfmadd231ps_fma(auVar169,auVar123,auVar14);
  auVar15 = vfmadd231ps_fma(auVar122,auVar123,auVar17);
  auVar17 = vfmadd231ps_fma(auVar103,auVar123,auVar104);
  auVar18 = vfmadd231ps_fma(auVar14,auVar213,auVar13);
  auVar104 = vfmadd231ps_fma(auVar15,auVar213,auVar16);
  auVar140 = vfmadd231ps_fma(auVar17,auVar213,auVar105);
  local_270._8_4_ = 0x7fffffff;
  local_270._0_8_ = 0x7fffffff7fffffff;
  local_270._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar154,local_270);
  auVar161._8_4_ = 0x219392ef;
  auVar161._0_8_ = 0x219392ef219392ef;
  auVar161._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar161,1);
  auVar14 = vblendvps_avx(auVar154,auVar161,auVar13);
  auVar13 = vandps_avx(auVar124,local_270);
  auVar13 = vcmpps_avx(auVar13,auVar161,1);
  auVar15 = vblendvps_avx(auVar124,auVar161,auVar13);
  auVar13 = vandps_avx(auVar162,local_270);
  auVar13 = vcmpps_avx(auVar13,auVar161,1);
  auVar13 = vblendvps_avx(auVar162,auVar161,auVar13);
  auVar16 = vrcpps_avx(auVar14);
  auVar181._8_4_ = 0x3f800000;
  auVar181._0_8_ = 0x3f8000003f800000;
  auVar181._12_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar14,auVar16,auVar181);
  auVar16 = vfmadd132ps_fma(auVar14,auVar16,auVar16);
  auVar14 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar14,auVar181);
  auVar17 = vfmadd132ps_fma(auVar15,auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar14,auVar181);
  auVar105 = vfmadd132ps_fma(auVar13,auVar14,auVar14);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar98 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar18);
  auVar162._0_4_ = auVar16._0_4_ * auVar13._0_4_;
  auVar162._4_4_ = auVar16._4_4_ * auVar13._4_4_;
  auVar162._8_4_ = auVar16._8_4_ * auVar13._8_4_;
  auVar162._12_4_ = auVar16._12_4_ * auVar13._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar98 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar14);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar18);
  auVar170._0_4_ = auVar16._0_4_ * auVar13._0_4_;
  auVar170._4_4_ = auVar16._4_4_ * auVar13._4_4_;
  auVar170._8_4_ = auVar16._8_4_ * auVar13._8_4_;
  auVar170._12_4_ = auVar16._12_4_ * auVar13._12_4_;
  auVar124._1_3_ = 0;
  auVar124[0] = PVar8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar14 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar98 * -2 + 6);
  auVar13 = vpmovsxwd_avx(auVar16);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar104);
  auVar186._0_4_ = auVar13._0_4_ * auVar17._0_4_;
  auVar186._4_4_ = auVar13._4_4_ * auVar17._4_4_;
  auVar186._8_4_ = auVar13._8_4_ * auVar17._8_4_;
  auVar186._12_4_ = auVar13._12_4_ * auVar17._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar14);
  auVar13 = vsubps_avx(auVar13,auVar104);
  auVar123._0_4_ = auVar17._0_4_ * auVar13._0_4_;
  auVar123._4_4_ = auVar17._4_4_ * auVar13._4_4_;
  auVar123._8_4_ = auVar17._8_4_ * auVar13._8_4_;
  auVar123._12_4_ = auVar17._12_4_ * auVar13._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar94 + uVar98 + 6);
  auVar13 = vpmovsxwd_avx(auVar17);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar140);
  auVar154._0_4_ = auVar105._0_4_ * auVar13._0_4_;
  auVar154._4_4_ = auVar105._4_4_ * auVar13._4_4_;
  auVar154._8_4_ = auVar105._8_4_ * auVar13._8_4_;
  auVar154._12_4_ = auVar105._12_4_ * auVar13._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar98 * 0x17 + 6);
  auVar13 = vpmovsxwd_avx(auVar18);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar140);
  auVar104._0_4_ = auVar105._0_4_ * auVar13._0_4_;
  auVar104._4_4_ = auVar105._4_4_ * auVar13._4_4_;
  auVar104._8_4_ = auVar105._8_4_ * auVar13._8_4_;
  auVar104._12_4_ = auVar105._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar162,auVar170);
  auVar14 = vpminsd_avx(auVar186,auVar123);
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar14 = vpminsd_avx(auVar154,auVar104);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar190._4_4_ = uVar100;
  auVar190._0_4_ = uVar100;
  auVar190._8_4_ = uVar100;
  auVar190._12_4_ = uVar100;
  auVar197 = ZEXT1664(auVar190);
  auVar14 = vmaxps_avx(auVar14,auVar190);
  auVar13 = vmaxps_avx(auVar13,auVar14);
  local_280._0_4_ = auVar13._0_4_ * 0.99999964;
  local_280._4_4_ = auVar13._4_4_ * 0.99999964;
  local_280._8_4_ = auVar13._8_4_ * 0.99999964;
  local_280._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar162,auVar170);
  auVar14 = vpmaxsd_avx(auVar186,auVar123);
  auVar13 = vminps_avx(auVar13,auVar14);
  auVar14 = vpmaxsd_avx(auVar154,auVar104);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar140._4_4_ = uVar100;
  auVar140._0_4_ = uVar100;
  auVar140._8_4_ = uVar100;
  auVar140._12_4_ = uVar100;
  auVar14 = vminps_avx(auVar14,auVar140);
  auVar13 = vminps_avx(auVar13,auVar14);
  auVar105._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar105._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar105._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar105._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar124[4] = PVar8;
  auVar124._5_3_ = 0;
  auVar124[8] = PVar8;
  auVar124._9_3_ = 0;
  auVar124[0xc] = PVar8;
  auVar124._13_3_ = 0;
  auVar14 = vpcmpgtd_avx(auVar124,_DAT_01f7fcf0);
  auVar13 = vcmpps_avx(local_280,auVar105,2);
  auVar13 = vandps_avx(auVar13,auVar14);
  uVar95 = vmovmskps_avx(auVar13);
  if (uVar95 == 0) {
    bVar92 = 0;
  }
  else {
    uVar95 = uVar95 & 0xff;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    do {
      auVar134 = local_460;
      auVar202 = auVar205._0_32_;
      lVar22 = 0;
      uVar98 = (ulong)uVar95;
      for (uVar94 = uVar98; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar98 = uVar98 - 1 & uVar98;
      local_570 = *(undefined4 *)(prim + lVar22 * 4 + 6);
      uVar94 = (ulong)(uint)((int)lVar22 << 6);
      uVar95 = *(uint *)(prim + 2);
      local_728 = (ulong)uVar95;
      pGVar10 = (context->scene->geometries).items[local_728].ptr;
      pPVar1 = prim + uVar94 + lVar75 + 0x16;
      local_680 = *(undefined8 *)pPVar1;
      uStack_678 = *(undefined8 *)(pPVar1 + 8);
      if (uVar98 != 0) {
        uVar96 = uVar98 - 1 & uVar98;
        for (uVar97 = uVar98; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
        }
        if (uVar96 != 0) {
          for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_660 = *(undefined1 (*) [16])(prim + uVar94 + lVar75 + 0x26);
      local_670 = *(undefined1 (*) [16])(prim + uVar94 + lVar75 + 0x36);
      _local_530 = *(undefined1 (*) [16])(prim + uVar94 + lVar75 + 0x46);
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar16 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar14 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar16);
      uVar100 = auVar14._0_4_;
      auVar163._4_4_ = uVar100;
      auVar163._0_4_ = uVar100;
      auVar163._8_4_ = uVar100;
      auVar163._12_4_ = uVar100;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar139 = pre->ray_space[k].vz.field_0.m128[0];
      fVar138 = pre->ray_space[k].vz.field_0.m128[1];
      fVar114 = pre->ray_space[k].vz.field_0.m128[2];
      fVar115 = pre->ray_space[k].vz.field_0.m128[3];
      auVar176._0_4_ = fVar139 * auVar14._0_4_;
      auVar176._4_4_ = fVar138 * auVar14._4_4_;
      auVar176._8_4_ = fVar114 * auVar14._8_4_;
      auVar176._12_4_ = fVar115 * auVar14._12_4_;
      auVar13 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar6,auVar13);
      auVar18 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar5,auVar163);
      auVar13 = vblendps_avx(auVar18,*(undefined1 (*) [16])pPVar1,8);
      auVar15 = vsubps_avx(local_660,auVar16);
      uVar100 = auVar15._0_4_;
      auVar177._4_4_ = uVar100;
      auVar177._0_4_ = uVar100;
      auVar177._8_4_ = uVar100;
      auVar177._12_4_ = uVar100;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar191._0_4_ = fVar139 * auVar15._0_4_;
      auVar191._4_4_ = fVar138 * auVar15._4_4_;
      auVar191._8_4_ = fVar114 * auVar15._8_4_;
      auVar191._12_4_ = fVar115 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar6,auVar14);
      auVar105 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar177);
      auVar14 = vblendps_avx(auVar105,local_660,8);
      auVar17 = vsubps_avx(local_670,auVar16);
      uVar100 = auVar17._0_4_;
      auVar182._4_4_ = uVar100;
      auVar182._0_4_ = uVar100;
      auVar182._8_4_ = uVar100;
      auVar182._12_4_ = uVar100;
      auVar15 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar201._0_4_ = fVar139 * auVar17._0_4_;
      auVar201._4_4_ = fVar138 * auVar17._4_4_;
      auVar201._8_4_ = fVar114 * auVar17._8_4_;
      auVar201._12_4_ = fVar115 * auVar17._12_4_;
      auVar15 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar6,auVar15);
      auVar104 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar182);
      auVar15 = vblendps_avx(auVar104,local_670,8);
      auVar17 = vsubps_avx(_local_530,auVar16);
      uVar100 = auVar17._0_4_;
      auVar183._4_4_ = uVar100;
      auVar183._0_4_ = uVar100;
      auVar183._8_4_ = uVar100;
      auVar183._12_4_ = uVar100;
      auVar16 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar206._0_4_ = fVar139 * auVar17._0_4_;
      auVar206._4_4_ = fVar138 * auVar17._4_4_;
      auVar206._8_4_ = fVar114 * auVar17._8_4_;
      auVar206._12_4_ = fVar115 * auVar17._12_4_;
      auVar16 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar6,auVar16);
      auVar140 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar183);
      auVar16 = vblendps_avx(auVar140,_local_530,8);
      auVar13 = vandps_avx(auVar13,local_270);
      auVar14 = vandps_avx(auVar14,local_270);
      auVar17 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vandps_avx(auVar15,local_270);
      auVar14 = vandps_avx(auVar16,local_270);
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar17,auVar13);
      auVar14 = vmovshdup_avx(auVar13);
      auVar14 = vmaxss_avx(auVar14,auVar13);
      auVar13 = vshufpd_avx(auVar13,auVar13,1);
      auVar13 = vmaxss_avx(auVar13,auVar14);
      lVar22 = (long)iVar9 * 0x44;
      auVar14 = vmovshdup_avx(auVar18);
      uVar101 = auVar14._0_8_;
      local_4e0._8_8_ = uVar101;
      local_4e0._0_8_ = uVar101;
      local_4e0._16_8_ = uVar101;
      local_4e0._24_8_ = uVar101;
      auVar14 = vmovshdup_avx(auVar105);
      uVar101 = auVar14._0_8_;
      auVar216._8_8_ = uVar101;
      auVar216._0_8_ = uVar101;
      auVar216._16_8_ = uVar101;
      auVar216._24_8_ = uVar101;
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x908);
      uVar199 = auVar104._0_4_;
      auVar147._4_4_ = uVar199;
      auVar147._0_4_ = uVar199;
      auVar147._8_4_ = uVar199;
      auVar147._12_4_ = uVar199;
      auVar147._16_4_ = uVar199;
      auVar147._20_4_ = uVar199;
      auVar147._24_4_ = uVar199;
      auVar147._28_4_ = uVar199;
      auVar14 = vmovshdup_avx(auVar104);
      uVar101 = auVar14._0_8_;
      auVar203._8_8_ = uVar101;
      auVar203._0_8_ = uVar101;
      auVar203._16_8_ = uVar101;
      auVar203._24_8_ = uVar101;
      pauVar2 = (undefined1 (*) [32])(bezier_basis0 + lVar22 + 0xd8c);
      auVar90 = *(undefined1 (*) [28])*pauVar2;
      local_6a0 = auVar140._0_4_;
      auVar14 = vmovshdup_avx(auVar140);
      uVar101 = auVar14._0_8_;
      auVar151._4_4_ = local_6a0 * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar151._0_4_ = local_6a0 * *(float *)*pauVar2;
      auVar151._8_4_ = local_6a0 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar151._12_4_ = local_6a0 * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar151._16_4_ = local_6a0 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar151._20_4_ = local_6a0 * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar151._24_4_ = local_6a0 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar151._28_4_ = *(undefined4 *)(bezier_basis0 + lVar22 + 0xda8);
      auVar15 = vfmadd231ps_fma(auVar151,auVar113,auVar147);
      fVar153 = auVar14._0_4_;
      auVar211._0_4_ = fVar153 * *(float *)*pauVar2;
      fVar160 = auVar14._4_4_;
      auVar211._4_4_ = fVar160 * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar211._8_4_ = fVar153 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar211._12_4_ = fVar160 * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar211._16_4_ = fVar153 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar211._20_4_ = fVar160 * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar211._24_4_ = fVar153 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar211._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar211,auVar113,auVar203);
      auVar151 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x484);
      uVar100 = auVar105._0_4_;
      local_6c0._4_4_ = uVar100;
      local_6c0._0_4_ = uVar100;
      local_6c0._8_4_ = uVar100;
      local_6c0._12_4_ = uVar100;
      local_6c0._16_4_ = uVar100;
      local_6c0._20_4_ = uVar100;
      local_6c0._24_4_ = uVar100;
      local_6c0._28_4_ = uVar100;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar151,local_6c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar151,auVar216);
      auVar211 = *(undefined1 (*) [32])(bezier_basis0 + lVar22);
      local_4a0._0_4_ = auVar18._0_4_;
      local_6e0._4_4_ = local_4a0._0_4_;
      local_6e0._0_4_ = local_4a0._0_4_;
      local_6e0._8_4_ = local_4a0._0_4_;
      local_6e0._12_4_ = local_4a0._0_4_;
      local_6e0._16_4_ = local_4a0._0_4_;
      local_6e0._20_4_ = local_4a0._0_4_;
      local_6e0._24_4_ = local_4a0._0_4_;
      local_6e0._28_4_ = local_4a0._0_4_;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar211,local_6e0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar211,local_4e0);
      local_340 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x908);
      fVar119 = *(float *)(bezier_basis1 + lVar22 + 0xd8c);
      fVar76 = *(float *)(bezier_basis1 + lVar22 + 0xd90);
      fVar77 = *(float *)(bezier_basis1 + lVar22 + 0xd94);
      fVar78 = *(float *)(bezier_basis1 + lVar22 + 0xd98);
      fVar79 = *(float *)(bezier_basis1 + lVar22 + 0xd9c);
      fVar80 = *(float *)(bezier_basis1 + lVar22 + 0xda0);
      fVar81 = *(float *)(bezier_basis1 + lVar22 + 0xda4);
      auVar7._4_4_ = fVar76 * local_6a0;
      auVar7._0_4_ = fVar119 * local_6a0;
      auVar7._8_4_ = fVar77 * local_6a0;
      auVar7._12_4_ = fVar78 * local_6a0;
      auVar7._16_4_ = fVar79 * local_6a0;
      auVar7._20_4_ = fVar80 * local_6a0;
      auVar7._24_4_ = fVar81 * local_6a0;
      auVar7._28_4_ = *(undefined4 *)(bezier_basis0 + lVar22 + 0xda8);
      auVar15 = vfmadd231ps_fma(auVar7,local_340,auVar147);
      auVar196._4_4_ = fVar76 * fVar160;
      auVar196._0_4_ = fVar119 * fVar153;
      auVar196._8_4_ = fVar77 * fVar153;
      auVar196._12_4_ = fVar78 * fVar160;
      auVar196._16_4_ = fVar79 * fVar153;
      auVar196._20_4_ = fVar80 * fVar160;
      auVar196._24_4_ = fVar81 * fVar153;
      auVar196._28_4_ = uVar199;
      auVar17 = vfmadd231ps_fma(auVar196,local_340,auVar203);
      auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x484);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar7,local_6c0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar7,auVar216);
      local_600 = *(undefined1 (*) [32])(bezier_basis1 + lVar22);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_600,local_6e0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_600,local_4e0);
      local_2c0 = ZEXT1632(auVar15);
      auVar127 = ZEXT1632(auVar16);
      auVar187 = vsubps_avx(local_2c0,auVar127);
      local_2e0 = ZEXT1632(auVar17);
      _local_300 = ZEXT1632(auVar14);
      _local_320 = vsubps_avx(local_2e0,_local_300);
      auVar107._0_4_ = auVar14._0_4_ * auVar187._0_4_;
      auVar107._4_4_ = auVar14._4_4_ * auVar187._4_4_;
      auVar107._8_4_ = auVar14._8_4_ * auVar187._8_4_;
      auVar107._12_4_ = auVar14._12_4_ * auVar187._12_4_;
      auVar107._16_4_ = auVar187._16_4_ * 0.0;
      auVar107._20_4_ = auVar187._20_4_ * 0.0;
      auVar107._24_4_ = auVar187._24_4_ * 0.0;
      auVar107._28_4_ = 0;
      fVar139 = local_320._0_4_;
      auVar128._0_4_ = auVar16._0_4_ * fVar139;
      fVar138 = local_320._4_4_;
      auVar128._4_4_ = auVar16._4_4_ * fVar138;
      fVar114 = local_320._8_4_;
      auVar128._8_4_ = auVar16._8_4_ * fVar114;
      fVar115 = local_320._12_4_;
      auVar128._12_4_ = auVar16._12_4_ * fVar115;
      fVar116 = local_320._16_4_;
      auVar128._16_4_ = fVar116 * 0.0;
      fVar117 = local_320._20_4_;
      auVar128._20_4_ = fVar117 * 0.0;
      fVar118 = local_320._24_4_;
      auVar128._24_4_ = fVar118 * 0.0;
      auVar128._28_4_ = 0;
      auVar107 = vsubps_avx(auVar107,auVar128);
      auVar14 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar121 = auVar14._0_8_;
      local_80._8_8_ = uVar121;
      local_80._0_8_ = uVar121;
      local_80._16_8_ = uVar121;
      local_80._24_8_ = uVar121;
      auVar15 = vpermilps_avx(local_660,0xff);
      uVar121 = auVar15._0_8_;
      local_a0._8_8_ = uVar121;
      local_a0._0_8_ = uVar121;
      local_a0._16_8_ = uVar121;
      local_a0._24_8_ = uVar121;
      auVar15 = vpermilps_avx(local_670,0xff);
      uVar121 = auVar15._0_8_;
      local_c0._8_8_ = uVar121;
      local_c0._0_8_ = uVar121;
      local_c0._16_8_ = uVar121;
      local_c0._24_8_ = uVar121;
      auVar15 = vpermilps_avx(_local_530,0xff);
      local_e0 = auVar15._0_8_;
      local_700._0_4_ = auVar90._0_4_;
      local_700._4_4_ = auVar90._4_4_;
      fStack_6f8 = auVar90._8_4_;
      fStack_6f4 = auVar90._12_4_;
      auStack_6f0._0_4_ = auVar90._16_4_;
      auStack_6f0._4_4_ = auVar90._20_4_;
      fStack_6e8 = auVar90._24_4_;
      fVar120 = auVar15._0_4_;
      fVar137 = auVar15._4_4_;
      auVar21._4_4_ = fVar137 * (float)local_700._4_4_;
      auVar21._0_4_ = fVar120 * (float)local_700._0_4_;
      auVar21._8_4_ = fVar120 * fStack_6f8;
      auVar21._12_4_ = fVar137 * fStack_6f4;
      auVar21._16_4_ = fVar120 * (float)auStack_6f0._0_4_;
      auVar21._20_4_ = fVar137 * (float)auStack_6f0._4_4_;
      auVar21._24_4_ = fVar120 * fStack_6e8;
      auVar21._28_4_ = local_4a0._0_4_;
      auVar15 = vfmadd231ps_fma(auVar21,local_c0,auVar113);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar151,local_a0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar211,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar150._4_4_ = fVar76 * fVar137;
      auVar150._0_4_ = fVar119 * fVar120;
      auVar150._8_4_ = fVar77 * fVar120;
      auVar150._12_4_ = fVar78 * fVar137;
      auVar150._16_4_ = fVar79 * fVar120;
      auVar150._20_4_ = fVar80 * fVar137;
      auVar150._24_4_ = fVar81 * fVar120;
      auVar150._28_4_ = auVar211._28_4_;
      auVar17 = vfmadd231ps_fma(auVar150,local_340,local_c0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar7,local_a0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_600,local_80);
      auVar192._4_4_ = fVar138 * fVar138;
      auVar192._0_4_ = fVar139 * fVar139;
      auVar192._8_4_ = fVar114 * fVar114;
      auVar192._12_4_ = fVar115 * fVar115;
      auVar192._16_4_ = fVar116 * fVar116;
      auVar192._20_4_ = fVar117 * fVar117;
      auVar192._24_4_ = fVar118 * fVar118;
      auVar192._28_4_ = auVar14._4_4_;
      auVar14 = vfmadd231ps_fma(auVar192,auVar187,auVar187);
      auVar196 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar17));
      auVar19._4_4_ = auVar196._4_4_ * auVar196._4_4_ * auVar14._4_4_;
      auVar19._0_4_ = auVar196._0_4_ * auVar196._0_4_ * auVar14._0_4_;
      auVar19._8_4_ = auVar196._8_4_ * auVar196._8_4_ * auVar14._8_4_;
      auVar19._12_4_ = auVar196._12_4_ * auVar196._12_4_ * auVar14._12_4_;
      auVar19._16_4_ = auVar196._16_4_ * auVar196._16_4_ * 0.0;
      auVar19._20_4_ = auVar196._20_4_ * auVar196._20_4_ * 0.0;
      auVar19._24_4_ = auVar196._24_4_ * auVar196._24_4_ * 0.0;
      auVar19._28_4_ = auVar196._28_4_;
      auVar20._4_4_ = auVar107._4_4_ * auVar107._4_4_;
      auVar20._0_4_ = auVar107._0_4_ * auVar107._0_4_;
      auVar20._8_4_ = auVar107._8_4_ * auVar107._8_4_;
      auVar20._12_4_ = auVar107._12_4_ * auVar107._12_4_;
      auVar20._16_4_ = auVar107._16_4_ * auVar107._16_4_;
      auVar20._20_4_ = auVar107._20_4_ * auVar107._20_4_;
      auVar20._24_4_ = auVar107._24_4_ * auVar107._24_4_;
      auVar20._28_4_ = auVar107._28_4_;
      auVar196 = vcmpps_avx(auVar20,auVar19,2);
      fVar139 = auVar13._0_4_ * 4.7683716e-07;
      auVar108._0_4_ = (float)iVar9;
      local_460._4_12_ = auVar140._4_12_;
      local_460._0_4_ = auVar108._0_4_;
      local_460._16_16_ = auVar134._16_16_;
      auVar108._4_4_ = auVar108._0_4_;
      auVar108._8_4_ = auVar108._0_4_;
      auVar108._12_4_ = auVar108._0_4_;
      auVar108._16_4_ = auVar108._0_4_;
      auVar108._20_4_ = auVar108._0_4_;
      auVar108._24_4_ = auVar108._0_4_;
      auVar108._28_4_ = auVar108._0_4_;
      auVar134 = vcmpps_avx(_DAT_01faff40,auVar108,1);
      auVar14 = vpermilps_avx(auVar18,0xaa);
      uVar121 = auVar14._0_8_;
      auVar155._8_8_ = uVar121;
      auVar155._0_8_ = uVar121;
      auVar155._16_8_ = uVar121;
      auVar155._24_8_ = uVar121;
      auVar13 = vpermilps_avx(auVar105,0xaa);
      uVar121 = auVar13._0_8_;
      local_100._8_8_ = uVar121;
      local_100._0_8_ = uVar121;
      local_100._16_8_ = uVar121;
      local_100._24_8_ = uVar121;
      auVar13 = vpermilps_avx(auVar104,0xaa);
      uVar121 = auVar13._0_8_;
      local_4a0._8_8_ = uVar121;
      local_4a0._0_8_ = uVar121;
      local_4a0._16_8_ = uVar121;
      local_4a0._24_8_ = uVar121;
      auVar13 = vshufps_avx(auVar140,auVar140,0xaa);
      uVar121 = auVar13._0_8_;
      register0x00001508 = uVar121;
      local_620 = uVar121;
      register0x00001510 = uVar121;
      register0x00001518 = uVar121;
      auVar107 = auVar134 & auVar196;
      uVar93 = *(uint *)(ray + k * 4 + 0x30);
      local_560._0_16_ = ZEXT416(uVar93);
      fStack_69c = local_6a0;
      fStack_698 = local_6a0;
      fStack_694 = local_6a0;
      fStack_690 = local_6a0;
      fStack_68c = local_6a0;
      fStack_688 = local_6a0;
      fStack_684 = local_6a0;
      if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0x7f,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar107 >> 0xbf,0) == '\0') &&
          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar107[0x1f]) {
        auVar205 = ZEXT3264(auVar202);
LAB_0159d107:
        auVar184 = ZEXT3264(CONCAT428(local_6a0,
                                      CONCAT424(local_6a0,
                                                CONCAT420(local_6a0,
                                                          CONCAT416(local_6a0,
                                                                    CONCAT412(local_6a0,
                                                                              CONCAT48(local_6a0,
                                                                                       CONCAT44(
                                                  local_6a0,local_6a0))))))));
        auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,CONCAT416(fVar153,
                                                  CONCAT412(fVar160,CONCAT48(fVar153,uVar101)))))));
LAB_0159d122:
        auVar210 = ZEXT3264(_local_620);
        auVar189 = ZEXT3264(local_6c0);
        uVar94 = 0;
        auVar159 = ZEXT3264(local_6e0);
      }
      else {
        local_500 = SUB84(pGVar10,0);
        uStack_4fc = (undefined4)((ulong)pGVar10 >> 0x20);
        _local_360 = vandps_avx(auVar196,auVar134);
        fVar120 = auVar13._0_4_;
        fVar137 = auVar13._4_4_;
        auVar134._4_4_ = fVar137 * fVar76;
        auVar134._0_4_ = fVar120 * fVar119;
        auVar134._8_4_ = fVar120 * fVar77;
        auVar134._12_4_ = fVar137 * fVar78;
        auVar134._16_4_ = fVar120 * fVar79;
        auVar134._20_4_ = fVar137 * fVar80;
        auVar134._24_4_ = fVar120 * fVar81;
        auVar134._28_4_ = local_360._28_4_;
        auVar13 = vfmadd213ps_fma(local_340,local_4a0,auVar134);
        auVar13 = vfmadd213ps_fma(auVar7,local_100,ZEXT1632(auVar13));
        auVar13 = vfmadd213ps_fma(local_600,auVar155,ZEXT1632(auVar13));
        local_600 = ZEXT1632(auVar13);
        auVar109._0_4_ = fVar120 * (float)local_700._0_4_;
        auVar109._4_4_ = fVar137 * (float)local_700._4_4_;
        auVar109._8_4_ = fVar120 * fStack_6f8;
        auVar109._12_4_ = fVar137 * fStack_6f4;
        auVar109._16_4_ = fVar120 * (float)auStack_6f0._0_4_;
        auVar109._20_4_ = fVar137 * (float)auStack_6f0._4_4_;
        auVar109._24_4_ = fVar120 * fStack_6e8;
        auVar109._28_4_ = 0;
        auVar13 = vfmadd213ps_fma(auVar113,local_4a0,auVar109);
        auVar13 = vfmadd213ps_fma(auVar151,local_100,ZEXT1632(auVar13));
        auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1210);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1694);
        auVar151 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1b18);
        fVar138 = *(float *)(bezier_basis0 + lVar22 + 0x1f9c);
        fVar114 = *(float *)(bezier_basis0 + lVar22 + 0x1fa0);
        fVar115 = *(float *)(bezier_basis0 + lVar22 + 0x1fa4);
        fVar116 = *(float *)(bezier_basis0 + lVar22 + 0x1fa8);
        fVar117 = *(float *)(bezier_basis0 + lVar22 + 0x1fac);
        fVar118 = *(float *)(bezier_basis0 + lVar22 + 0x1fb0);
        fVar119 = *(float *)(bezier_basis0 + lVar22 + 0x1fb4);
        auVar214._4_4_ = local_6a0 * fVar114;
        auVar214._0_4_ = local_6a0 * fVar138;
        auVar214._8_4_ = local_6a0 * fVar115;
        auVar214._12_4_ = local_6a0 * fVar116;
        auVar214._16_4_ = local_6a0 * fVar117;
        auVar214._20_4_ = local_6a0 * fVar118;
        auVar214._24_4_ = local_6a0 * fVar119;
        auVar214._28_4_ = local_320._28_4_;
        auVar24._4_4_ = fVar160 * fVar114;
        auVar24._0_4_ = fVar153 * fVar138;
        auVar24._8_4_ = fVar153 * fVar115;
        auVar24._12_4_ = fVar160 * fVar116;
        auVar24._16_4_ = fVar153 * fVar117;
        auVar24._20_4_ = fVar160 * fVar118;
        auVar24._24_4_ = fVar153 * fVar119;
        auVar24._28_4_ = *(undefined4 *)(bezier_basis1 + lVar22 + 0xda8);
        auVar25._4_4_ = fVar137 * fVar114;
        auVar25._0_4_ = fVar120 * fVar138;
        auVar25._8_4_ = fVar120 * fVar115;
        auVar25._12_4_ = fVar137 * fVar116;
        auVar25._16_4_ = fVar120 * fVar117;
        auVar25._20_4_ = fVar137 * fVar118;
        auVar25._24_4_ = fVar120 * fVar119;
        auVar25._28_4_ = auVar187._28_4_;
        auVar18 = vfmadd231ps_fma(auVar214,auVar151,auVar147);
        auVar105 = vfmadd231ps_fma(auVar24,auVar151,auVar203);
        auVar104 = vfmadd231ps_fma(auVar25,local_4a0,auVar151);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar113,local_6c0);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar113,auVar216);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_100,auVar113);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar134,local_6e0);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar134,local_4e0);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar155,auVar134);
        fVar138 = *(float *)(bezier_basis1 + lVar22 + 0x1f9c);
        fVar114 = *(float *)(bezier_basis1 + lVar22 + 0x1fa0);
        fVar115 = *(float *)(bezier_basis1 + lVar22 + 0x1fa4);
        fVar116 = *(float *)(bezier_basis1 + lVar22 + 0x1fa8);
        fVar117 = *(float *)(bezier_basis1 + lVar22 + 0x1fac);
        fVar118 = *(float *)(bezier_basis1 + lVar22 + 0x1fb0);
        fVar119 = *(float *)(bezier_basis1 + lVar22 + 0x1fb4);
        auVar113._4_4_ = local_6a0 * fVar114;
        auVar113._0_4_ = local_6a0 * fVar138;
        auVar113._8_4_ = local_6a0 * fVar115;
        auVar113._12_4_ = local_6a0 * fVar116;
        auVar113._16_4_ = local_6a0 * fVar117;
        auVar113._20_4_ = local_6a0 * fVar118;
        auVar113._24_4_ = local_6a0 * fVar119;
        auVar113._28_4_ = local_6a0;
        auVar26._4_4_ = fVar160 * fVar114;
        auVar26._0_4_ = fVar153 * fVar138;
        auVar26._8_4_ = fVar153 * fVar115;
        auVar26._12_4_ = fVar160 * fVar116;
        auVar26._16_4_ = fVar153 * fVar117;
        auVar26._20_4_ = fVar160 * fVar118;
        auVar26._24_4_ = fVar153 * fVar119;
        auVar26._28_4_ = fVar160;
        auVar27._4_4_ = fVar114 * fVar137;
        auVar27._0_4_ = fVar138 * fVar120;
        auVar27._8_4_ = fVar115 * fVar120;
        auVar27._12_4_ = fVar116 * fVar137;
        auVar27._16_4_ = fVar117 * fVar120;
        auVar27._20_4_ = fVar118 * fVar137;
        auVar27._24_4_ = fVar119 * fVar120;
        auVar27._28_4_ = auVar14._4_4_;
        auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1b18);
        auVar14 = vfmadd231ps_fma(auVar113,auVar134,auVar147);
        auVar140 = vfmadd231ps_fma(auVar26,auVar134,auVar203);
        auVar123 = vfmadd231ps_fma(auVar27,auVar134,local_4a0);
        auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1694);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar134,local_6c0);
        auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar134,auVar216);
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),local_100,auVar134);
        auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1210);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar134,local_6e0);
        auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar134,local_4e0);
        auVar129._8_4_ = 0x7fffffff;
        auVar129._0_8_ = 0x7fffffff7fffffff;
        auVar129._12_4_ = 0x7fffffff;
        auVar129._16_4_ = 0x7fffffff;
        auVar129._20_4_ = 0x7fffffff;
        auVar129._24_4_ = 0x7fffffff;
        auVar129._28_4_ = 0x7fffffff;
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar155,auVar134);
        auVar134 = vandps_avx(ZEXT1632(auVar18),auVar129);
        auVar113 = vandps_avx(ZEXT1632(auVar105),auVar129);
        auVar113 = vmaxps_avx(auVar134,auVar113);
        auVar134 = vandps_avx(ZEXT1632(auVar104),auVar129);
        auVar134 = vmaxps_avx(auVar113,auVar134);
        auVar148._4_4_ = fVar139;
        auVar148._0_4_ = fVar139;
        auVar148._8_4_ = fVar139;
        auVar148._12_4_ = fVar139;
        auVar148._16_4_ = fVar139;
        auVar148._20_4_ = fVar139;
        auVar148._24_4_ = fVar139;
        auVar148._28_4_ = fVar139;
        auVar134 = vcmpps_avx(auVar134,auVar148,1);
        auVar151 = vblendvps_avx(ZEXT1632(auVar18),auVar187,auVar134);
        auVar7 = vblendvps_avx(ZEXT1632(auVar105),_local_320,auVar134);
        auVar134 = vandps_avx(ZEXT1632(auVar14),auVar129);
        auVar113 = vandps_avx(ZEXT1632(auVar140),auVar129);
        auVar196 = vmaxps_avx(auVar134,auVar113);
        auVar134 = vandps_avx(ZEXT1632(auVar123),auVar129);
        auVar134 = vmaxps_avx(auVar196,auVar134);
        auVar107 = vcmpps_avx(auVar134,auVar148,1);
        auVar134 = vblendvps_avx(ZEXT1632(auVar14),auVar187,auVar107);
        auVar196 = vblendvps_avx(ZEXT1632(auVar140),_local_320,auVar107);
        auVar13 = vfmadd213ps_fma(auVar211,auVar155,ZEXT1632(auVar13));
        auVar14 = vfmadd213ps_fma(auVar151,auVar151,ZEXT832(0) << 0x20);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar7,auVar7);
        auVar211 = vrsqrtps_avx(ZEXT1632(auVar14));
        fVar138 = auVar211._0_4_;
        fVar114 = auVar211._4_4_;
        fVar115 = auVar211._8_4_;
        fVar116 = auVar211._12_4_;
        fVar117 = auVar211._16_4_;
        fVar118 = auVar211._20_4_;
        fVar119 = auVar211._24_4_;
        auVar187._4_4_ = fVar114 * fVar114 * fVar114 * auVar14._4_4_ * -0.5;
        auVar187._0_4_ = fVar138 * fVar138 * fVar138 * auVar14._0_4_ * -0.5;
        auVar187._8_4_ = fVar115 * fVar115 * fVar115 * auVar14._8_4_ * -0.5;
        auVar187._12_4_ = fVar116 * fVar116 * fVar116 * auVar14._12_4_ * -0.5;
        auVar187._16_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar187._20_4_ = fVar118 * fVar118 * fVar118 * -0.0;
        auVar187._24_4_ = fVar119 * fVar119 * fVar119 * -0.0;
        auVar187._28_4_ = 0;
        auVar166._8_4_ = 0x3fc00000;
        auVar166._0_8_ = 0x3fc000003fc00000;
        auVar166._12_4_ = 0x3fc00000;
        auVar166._16_4_ = 0x3fc00000;
        auVar166._20_4_ = 0x3fc00000;
        auVar166._24_4_ = 0x3fc00000;
        auVar166._28_4_ = 0x3fc00000;
        auVar14 = vfmadd231ps_fma(auVar187,auVar166,auVar211);
        fVar138 = auVar14._0_4_;
        fVar114 = auVar14._4_4_;
        auVar28._4_4_ = auVar7._4_4_ * fVar114;
        auVar28._0_4_ = auVar7._0_4_ * fVar138;
        fVar115 = auVar14._8_4_;
        auVar28._8_4_ = auVar7._8_4_ * fVar115;
        fVar116 = auVar14._12_4_;
        auVar28._12_4_ = auVar7._12_4_ * fVar116;
        auVar28._16_4_ = auVar7._16_4_ * 0.0;
        auVar28._20_4_ = auVar7._20_4_ * 0.0;
        auVar28._24_4_ = auVar7._24_4_ * 0.0;
        auVar28._28_4_ = auVar211._28_4_;
        auVar29._4_4_ = -auVar151._4_4_ * fVar114;
        auVar29._0_4_ = -auVar151._0_4_ * fVar138;
        auVar29._8_4_ = -auVar151._8_4_ * fVar115;
        auVar29._12_4_ = -auVar151._12_4_ * fVar116;
        auVar29._16_4_ = -auVar151._16_4_ * 0.0;
        auVar29._20_4_ = -auVar151._20_4_ * 0.0;
        auVar29._24_4_ = -auVar151._24_4_ * 0.0;
        auVar29._28_4_ = auVar113._28_4_;
        auVar14 = vfmadd213ps_fma(auVar134,auVar134,ZEXT832(0) << 0x20);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar196,auVar196);
        auVar113 = vrsqrtps_avx(ZEXT1632(auVar14));
        auVar30._28_4_ = auVar107._28_4_;
        auVar30._0_28_ =
             ZEXT1628(CONCAT412(fVar116 * 0.0,
                                CONCAT48(fVar115 * 0.0,CONCAT44(fVar114 * 0.0,fVar138 * 0.0))));
        fVar138 = auVar113._0_4_;
        fVar114 = auVar113._4_4_;
        fVar115 = auVar113._8_4_;
        fVar116 = auVar113._12_4_;
        fVar117 = auVar113._16_4_;
        fVar118 = auVar113._20_4_;
        fVar119 = auVar113._24_4_;
        auVar31._4_4_ = fVar114 * fVar114 * fVar114 * auVar14._4_4_ * -0.5;
        auVar31._0_4_ = fVar138 * fVar138 * fVar138 * auVar14._0_4_ * -0.5;
        auVar31._8_4_ = fVar115 * fVar115 * fVar115 * auVar14._8_4_ * -0.5;
        auVar31._12_4_ = fVar116 * fVar116 * fVar116 * auVar14._12_4_ * -0.5;
        auVar31._16_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar31._20_4_ = fVar118 * fVar118 * fVar118 * -0.0;
        auVar31._24_4_ = fVar119 * fVar119 * fVar119 * -0.0;
        auVar31._28_4_ = 0;
        auVar14 = vfmadd231ps_fma(auVar31,auVar166,auVar113);
        fVar138 = auVar14._0_4_;
        fVar114 = auVar14._4_4_;
        auVar32._4_4_ = auVar196._4_4_ * fVar114;
        auVar32._0_4_ = auVar196._0_4_ * fVar138;
        fVar115 = auVar14._8_4_;
        auVar32._8_4_ = auVar196._8_4_ * fVar115;
        fVar116 = auVar14._12_4_;
        auVar32._12_4_ = auVar196._12_4_ * fVar116;
        auVar32._16_4_ = auVar196._16_4_ * 0.0;
        auVar32._20_4_ = auVar196._20_4_ * 0.0;
        auVar32._24_4_ = auVar196._24_4_ * 0.0;
        auVar32._28_4_ = 0;
        auVar33._4_4_ = -auVar134._4_4_ * fVar114;
        auVar33._0_4_ = -auVar134._0_4_ * fVar138;
        auVar33._8_4_ = -auVar134._8_4_ * fVar115;
        auVar33._12_4_ = -auVar134._12_4_ * fVar116;
        auVar33._16_4_ = -auVar134._16_4_ * 0.0;
        auVar33._20_4_ = -auVar134._20_4_ * 0.0;
        auVar33._24_4_ = -auVar134._24_4_ * 0.0;
        auVar33._28_4_ = auVar196._28_4_;
        auVar34._28_4_ = auVar113._28_4_;
        auVar34._0_28_ =
             ZEXT1628(CONCAT412(fVar116 * 0.0,
                                CONCAT48(fVar115 * 0.0,CONCAT44(fVar114 * 0.0,fVar138 * 0.0))));
        auVar14 = vfmadd213ps_fma(auVar28,ZEXT1632(auVar15),auVar127);
        auVar134 = ZEXT1632(auVar15);
        auVar18 = vfmadd213ps_fma(auVar29,auVar134,_local_300);
        auVar105 = vfmadd213ps_fma(auVar30,auVar134,ZEXT1632(auVar13));
        auVar103 = vfnmadd213ps_fma(auVar28,auVar134,auVar127);
        auVar104 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar17),local_2c0);
        auVar124 = vfnmadd213ps_fma(auVar29,auVar134,_local_300);
        auVar134 = ZEXT1632(auVar17);
        auVar140 = vfmadd213ps_fma(auVar33,auVar134,local_2e0);
        auVar214 = ZEXT1632(auVar15);
        auVar102 = vfnmadd231ps_fma(ZEXT1632(auVar13),auVar214,auVar30);
        auVar15 = vfmadd213ps_fma(auVar34,auVar134,local_600);
        auVar154 = vfnmadd213ps_fma(auVar32,auVar134,local_2c0);
        auVar162 = vfnmadd213ps_fma(auVar33,auVar134,local_2e0);
        auVar122 = vfnmadd231ps_fma(local_600,ZEXT1632(auVar17),auVar34);
        auVar134 = vsubps_avx(ZEXT1632(auVar140),ZEXT1632(auVar124));
        auVar113 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar102));
        auVar127._4_4_ = auVar102._4_4_ * auVar134._4_4_;
        auVar127._0_4_ = auVar102._0_4_ * auVar134._0_4_;
        auVar127._8_4_ = auVar102._8_4_ * auVar134._8_4_;
        auVar127._12_4_ = auVar102._12_4_ * auVar134._12_4_;
        auVar127._16_4_ = auVar134._16_4_ * 0.0;
        auVar127._20_4_ = auVar134._20_4_ * 0.0;
        auVar127._24_4_ = auVar134._24_4_ * 0.0;
        auVar127._28_4_ = 0;
        auVar123 = vfmsub231ps_fma(auVar127,ZEXT1632(auVar124),auVar113);
        auVar35._4_4_ = auVar103._4_4_ * auVar113._4_4_;
        auVar35._0_4_ = auVar103._0_4_ * auVar113._0_4_;
        auVar35._8_4_ = auVar103._8_4_ * auVar113._8_4_;
        auVar35._12_4_ = auVar103._12_4_ * auVar113._12_4_;
        auVar35._16_4_ = auVar113._16_4_ * 0.0;
        auVar35._20_4_ = auVar113._20_4_ * 0.0;
        auVar35._24_4_ = auVar113._24_4_ * 0.0;
        auVar35._28_4_ = auVar113._28_4_;
        auVar187 = ZEXT1632(auVar103);
        auVar113 = vsubps_avx(ZEXT1632(auVar104),auVar187);
        auVar13 = vfmsub231ps_fma(auVar35,ZEXT1632(auVar102),auVar113);
        auVar36._4_4_ = auVar124._4_4_ * auVar113._4_4_;
        auVar36._0_4_ = auVar124._0_4_ * auVar113._0_4_;
        auVar36._8_4_ = auVar124._8_4_ * auVar113._8_4_;
        auVar36._12_4_ = auVar124._12_4_ * auVar113._12_4_;
        auVar36._16_4_ = auVar113._16_4_ * 0.0;
        auVar36._20_4_ = auVar113._20_4_ * 0.0;
        auVar36._24_4_ = auVar113._24_4_ * 0.0;
        auVar36._28_4_ = auVar113._28_4_;
        auVar103 = vfmsub231ps_fma(auVar36,auVar187,auVar134);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        _auStack_6f0 = SUB3216(*pauVar2,0x10);
        _local_700 = local_360._16_16_;
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar123));
        auVar150 = vcmpps_avx(ZEXT1632(auVar13),ZEXT832(0) << 0x20,2);
        auVar134 = vblendvps_avx(ZEXT1632(auVar154),ZEXT1632(auVar14),auVar150);
        auVar113 = vblendvps_avx(ZEXT1632(auVar162),ZEXT1632(auVar18),auVar150);
        auVar151 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar105),auVar150);
        auVar211 = vblendvps_avx(auVar187,ZEXT1632(auVar104),auVar150);
        auVar7 = vblendvps_avx(ZEXT1632(auVar124),ZEXT1632(auVar140),auVar150);
        auVar196 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar15),auVar150);
        auVar187 = vblendvps_avx(ZEXT1632(auVar104),auVar187,auVar150);
        auVar107 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar124),auVar150);
        auVar13 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar21 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar102),auVar150);
        auVar192 = vsubps_avx(auVar187,auVar134);
        auVar107 = vsubps_avx(auVar107,auVar113);
        auVar19 = vsubps_avx(auVar21,auVar151);
        auVar20 = vsubps_avx(auVar134,auVar211);
        auVar127 = vsubps_avx(auVar113,auVar7);
        auVar128 = vsubps_avx(auVar151,auVar196);
        auVar37._4_4_ = auVar19._4_4_ * auVar134._4_4_;
        auVar37._0_4_ = auVar19._0_4_ * auVar134._0_4_;
        auVar37._8_4_ = auVar19._8_4_ * auVar134._8_4_;
        auVar37._12_4_ = auVar19._12_4_ * auVar134._12_4_;
        auVar37._16_4_ = auVar19._16_4_ * auVar134._16_4_;
        auVar37._20_4_ = auVar19._20_4_ * auVar134._20_4_;
        auVar37._24_4_ = auVar19._24_4_ * auVar134._24_4_;
        auVar37._28_4_ = auVar21._28_4_;
        auVar14 = vfmsub231ps_fma(auVar37,auVar151,auVar192);
        auVar38._4_4_ = auVar192._4_4_ * auVar113._4_4_;
        auVar38._0_4_ = auVar192._0_4_ * auVar113._0_4_;
        auVar38._8_4_ = auVar192._8_4_ * auVar113._8_4_;
        auVar38._12_4_ = auVar192._12_4_ * auVar113._12_4_;
        auVar38._16_4_ = auVar192._16_4_ * auVar113._16_4_;
        auVar38._20_4_ = auVar192._20_4_ * auVar113._20_4_;
        auVar38._24_4_ = auVar192._24_4_ * auVar113._24_4_;
        auVar38._28_4_ = auVar187._28_4_;
        auVar15 = vfmsub231ps_fma(auVar38,auVar134,auVar107);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar110._0_4_ = auVar107._0_4_ * auVar151._0_4_;
        auVar110._4_4_ = auVar107._4_4_ * auVar151._4_4_;
        auVar110._8_4_ = auVar107._8_4_ * auVar151._8_4_;
        auVar110._12_4_ = auVar107._12_4_ * auVar151._12_4_;
        auVar110._16_4_ = auVar107._16_4_ * auVar151._16_4_;
        auVar110._20_4_ = auVar107._20_4_ * auVar151._20_4_;
        auVar110._24_4_ = auVar107._24_4_ * auVar151._24_4_;
        auVar110._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar110,auVar113,auVar19);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar111._0_4_ = auVar128._0_4_ * auVar211._0_4_;
        auVar111._4_4_ = auVar128._4_4_ * auVar211._4_4_;
        auVar111._8_4_ = auVar128._8_4_ * auVar211._8_4_;
        auVar111._12_4_ = auVar128._12_4_ * auVar211._12_4_;
        auVar111._16_4_ = auVar128._16_4_ * auVar211._16_4_;
        auVar111._20_4_ = auVar128._20_4_ * auVar211._20_4_;
        auVar111._24_4_ = auVar128._24_4_ * auVar211._24_4_;
        auVar111._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar111,auVar20,auVar196);
        auVar39._4_4_ = auVar127._4_4_ * auVar196._4_4_;
        auVar39._0_4_ = auVar127._0_4_ * auVar196._0_4_;
        auVar39._8_4_ = auVar127._8_4_ * auVar196._8_4_;
        auVar39._12_4_ = auVar127._12_4_ * auVar196._12_4_;
        auVar39._16_4_ = auVar127._16_4_ * auVar196._16_4_;
        auVar39._20_4_ = auVar127._20_4_ * auVar196._20_4_;
        auVar39._24_4_ = auVar127._24_4_ * auVar196._24_4_;
        auVar39._28_4_ = auVar196._28_4_;
        auVar18 = vfmsub231ps_fma(auVar39,auVar7,auVar128);
        auVar40._4_4_ = auVar20._4_4_ * auVar7._4_4_;
        auVar40._0_4_ = auVar20._0_4_ * auVar7._0_4_;
        auVar40._8_4_ = auVar20._8_4_ * auVar7._8_4_;
        auVar40._12_4_ = auVar20._12_4_ * auVar7._12_4_;
        auVar40._16_4_ = auVar20._16_4_ * auVar7._16_4_;
        auVar40._20_4_ = auVar20._20_4_ * auVar7._20_4_;
        auVar40._24_4_ = auVar20._24_4_ * auVar7._24_4_;
        auVar40._28_4_ = auVar7._28_4_;
        auVar105 = vfmsub231ps_fma(auVar40,auVar127,auVar211);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar211 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar18));
        auVar211 = vcmpps_avx(auVar211,ZEXT832(0) << 0x20,2);
        auVar14 = vpackssdw_avx(auVar211._0_16_,auVar211._16_16_);
        auVar13 = vpand_avx(auVar13,auVar14);
        auVar211 = vpmovsxwd_avx2(auVar13);
        if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar211 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar211 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar211 >> 0x7f,0) == '\0') &&
              (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar211 >> 0xbf,0) == '\0') &&
            (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar211[0x1f]) {
LAB_0159e68d:
          auVar180 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar205 = ZEXT3264(auVar202);
        }
        else {
          auVar41._4_4_ = auVar107._4_4_ * auVar128._4_4_;
          auVar41._0_4_ = auVar107._0_4_ * auVar128._0_4_;
          auVar41._8_4_ = auVar107._8_4_ * auVar128._8_4_;
          auVar41._12_4_ = auVar107._12_4_ * auVar128._12_4_;
          auVar41._16_4_ = auVar107._16_4_ * auVar128._16_4_;
          auVar41._20_4_ = auVar107._20_4_ * auVar128._20_4_;
          auVar41._24_4_ = auVar107._24_4_ * auVar128._24_4_;
          auVar41._28_4_ = auVar211._28_4_;
          auVar140 = vfmsub231ps_fma(auVar41,auVar127,auVar19);
          auVar130._0_4_ = auVar20._0_4_ * auVar19._0_4_;
          auVar130._4_4_ = auVar20._4_4_ * auVar19._4_4_;
          auVar130._8_4_ = auVar20._8_4_ * auVar19._8_4_;
          auVar130._12_4_ = auVar20._12_4_ * auVar19._12_4_;
          auVar130._16_4_ = auVar20._16_4_ * auVar19._16_4_;
          auVar130._20_4_ = auVar20._20_4_ * auVar19._20_4_;
          auVar130._24_4_ = auVar20._24_4_ * auVar19._24_4_;
          auVar130._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar130,auVar192,auVar128);
          auVar42._4_4_ = auVar192._4_4_ * auVar127._4_4_;
          auVar42._0_4_ = auVar192._0_4_ * auVar127._0_4_;
          auVar42._8_4_ = auVar192._8_4_ * auVar127._8_4_;
          auVar42._12_4_ = auVar192._12_4_ * auVar127._12_4_;
          auVar42._16_4_ = auVar192._16_4_ * auVar127._16_4_;
          auVar42._20_4_ = auVar192._20_4_ * auVar127._20_4_;
          auVar42._24_4_ = auVar192._24_4_ * auVar127._24_4_;
          auVar42._28_4_ = auVar192._28_4_;
          auVar123 = vfmsub231ps_fma(auVar42,auVar20,auVar107);
          auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar104),ZEXT1632(auVar123));
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar140),_DAT_01faff00);
          auVar211 = vrcpps_avx(ZEXT1632(auVar105));
          auVar204._8_4_ = 0x3f800000;
          auVar204._0_8_ = 0x3f8000003f800000;
          auVar204._12_4_ = 0x3f800000;
          auVar204._16_4_ = 0x3f800000;
          auVar204._20_4_ = 0x3f800000;
          auVar204._24_4_ = 0x3f800000;
          auVar204._28_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar211,ZEXT1632(auVar105),auVar204);
          auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar211,auVar211);
          auVar43._4_4_ = auVar123._4_4_ * auVar151._4_4_;
          auVar43._0_4_ = auVar123._0_4_ * auVar151._0_4_;
          auVar43._8_4_ = auVar123._8_4_ * auVar151._8_4_;
          auVar43._12_4_ = auVar123._12_4_ * auVar151._12_4_;
          auVar43._16_4_ = auVar151._16_4_ * 0.0;
          auVar43._20_4_ = auVar151._20_4_ * 0.0;
          auVar43._24_4_ = auVar151._24_4_ * 0.0;
          auVar43._28_4_ = auVar151._28_4_;
          auVar104 = vfmadd231ps_fma(auVar43,auVar113,ZEXT1632(auVar104));
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT1632(auVar140),auVar134);
          fVar138 = auVar14._0_4_;
          fVar114 = auVar14._4_4_;
          fVar115 = auVar14._8_4_;
          fVar116 = auVar14._12_4_;
          auVar44._28_4_ = auVar113._28_4_;
          auVar44._0_28_ =
               ZEXT1628(CONCAT412(fVar116 * auVar104._12_4_,
                                  CONCAT48(fVar115 * auVar104._8_4_,
                                           CONCAT44(fVar114 * auVar104._4_4_,
                                                    fVar138 * auVar104._0_4_))));
          auVar112._4_4_ = uVar93;
          auVar112._0_4_ = uVar93;
          auVar112._8_4_ = uVar93;
          auVar112._12_4_ = uVar93;
          auVar112._16_4_ = uVar93;
          auVar112._20_4_ = uVar93;
          auVar112._24_4_ = uVar93;
          auVar112._28_4_ = uVar93;
          uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar131._4_4_ = uVar100;
          auVar131._0_4_ = uVar100;
          auVar131._8_4_ = uVar100;
          auVar131._12_4_ = uVar100;
          auVar131._16_4_ = uVar100;
          auVar131._20_4_ = uVar100;
          auVar131._24_4_ = uVar100;
          auVar131._28_4_ = uVar100;
          auVar134 = vcmpps_avx(auVar112,auVar44,2);
          auVar113 = vcmpps_avx(auVar44,auVar131,2);
          auVar134 = vandps_avx(auVar113,auVar134);
          auVar14 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
          auVar13 = vpand_avx(auVar13,auVar14);
          auVar134 = vpmovsxwd_avx2(auVar13);
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar134 >> 0x7f,0) == '\0') &&
                (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0xbf,0) == '\0') &&
              (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar134[0x1f]) goto LAB_0159e68d;
          auVar134 = vcmpps_avx(ZEXT1632(auVar105),ZEXT832(0) << 0x20,4);
          auVar14 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
          auVar13 = vpand_avx(auVar13,auVar14);
          auVar134 = vpmovsxwd_avx2(auVar13);
          auVar180 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar205 = ZEXT3264(auVar202);
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0x7f,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar134 >> 0xbf,0) != '\0') ||
              (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar134[0x1f] < '\0') {
            auVar113 = ZEXT1632(CONCAT412(fVar116 * auVar15._12_4_,
                                          CONCAT48(fVar115 * auVar15._8_4_,
                                                   CONCAT44(fVar114 * auVar15._4_4_,
                                                            fVar138 * auVar15._0_4_))));
            auVar45._28_4_ = local_480._28_4_;
            auVar45._0_28_ =
                 ZEXT1628(CONCAT412(fVar116 * auVar18._12_4_,
                                    CONCAT48(fVar115 * auVar18._8_4_,
                                             CONCAT44(fVar114 * auVar18._4_4_,
                                                      fVar138 * auVar18._0_4_))));
            auVar167._8_4_ = 0x3f800000;
            auVar167._0_8_ = 0x3f8000003f800000;
            auVar167._12_4_ = 0x3f800000;
            auVar167._16_4_ = 0x3f800000;
            auVar167._20_4_ = 0x3f800000;
            auVar167._24_4_ = 0x3f800000;
            auVar167._28_4_ = 0x3f800000;
            auVar202 = vsubps_avx(auVar167,auVar113);
            auVar202 = vblendvps_avx(auVar202,auVar113,auVar150);
            auVar205 = ZEXT3264(auVar202);
            auVar202 = vsubps_avx(auVar167,auVar45);
            local_380 = vblendvps_avx(auVar202,auVar45,auVar150);
            auVar180 = ZEXT3264(auVar134);
            local_480 = auVar44;
          }
        }
        auVar210 = ZEXT3264(_local_620);
        auVar136 = ZEXT3264(auVar155);
        auVar134 = auVar180._0_32_;
        if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0x7f,0) == '\0') &&
              (auVar180 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar134 >> 0xbf,0) == '\0') &&
            (auVar180 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar180[0x1f]) goto LAB_0159d107;
        auVar202 = vsubps_avx(ZEXT1632(auVar17),auVar214);
        local_720 = auVar205._0_32_;
        auVar13 = vfmadd213ps_fma(auVar202,local_720,auVar214);
        fVar138 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar202._4_4_ = (auVar13._4_4_ + auVar13._4_4_) * fVar138;
        auVar202._0_4_ = (auVar13._0_4_ + auVar13._0_4_) * fVar138;
        auVar202._8_4_ = (auVar13._8_4_ + auVar13._8_4_) * fVar138;
        auVar202._12_4_ = (auVar13._12_4_ + auVar13._12_4_) * fVar138;
        auVar202._16_4_ = fVar138 * 0.0;
        auVar202._20_4_ = fVar138 * 0.0;
        auVar202._24_4_ = fVar138 * 0.0;
        auVar202._28_4_ = 0;
        auVar202 = vcmpps_avx(local_480,auVar202,6);
        auVar113 = auVar134 & auVar202;
        auVar184 = ZEXT3264(CONCAT428(local_6a0,
                                      CONCAT424(local_6a0,
                                                CONCAT420(local_6a0,
                                                          CONCAT416(local_6a0,
                                                                    CONCAT412(local_6a0,
                                                                              CONCAT48(local_6a0,
                                                                                       CONCAT44(
                                                  local_6a0,local_6a0))))))));
        auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,CONCAT416(fVar153,
                                                  CONCAT412(fVar160,CONCAT48(fVar153,uVar101)))))));
        auVar189 = ZEXT3264(local_6c0);
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0xbf,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar113[0x1f] < '\0') {
          auVar132._8_4_ = 0xbf800000;
          auVar132._0_8_ = 0xbf800000bf800000;
          auVar132._12_4_ = 0xbf800000;
          auVar132._16_4_ = 0xbf800000;
          auVar132._20_4_ = 0xbf800000;
          auVar132._24_4_ = 0xbf800000;
          auVar132._28_4_ = 0xbf800000;
          auVar149._8_4_ = 0x40000000;
          auVar149._0_8_ = 0x4000000040000000;
          auVar149._12_4_ = 0x40000000;
          auVar149._16_4_ = 0x40000000;
          auVar149._20_4_ = 0x40000000;
          auVar149._24_4_ = 0x40000000;
          auVar149._28_4_ = 0x40000000;
          auVar13 = vfmadd213ps_fma(local_380,auVar149,auVar132);
          local_240 = ZEXT1632(auVar13);
          local_200 = 0;
          local_1e0 = local_660._0_8_;
          uStack_1d8 = local_660._8_8_;
          local_1d0 = local_670._0_8_;
          uStack_1c8 = local_670._8_8_;
          local_380 = local_240;
          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            auVar159 = ZEXT3264(local_6e0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar94 = CONCAT71((int7)((ulong)context->args >> 8),1),
               pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar134 = vandps_avx(auVar202,auVar134);
              fVar138 = 1.0 / auVar108._0_4_;
              local_180[0] = fVar138 * (auVar205._0_4_ + 0.0);
              local_180[1] = fVar138 * (auVar205._4_4_ + 1.0);
              local_180[2] = fVar138 * (auVar205._8_4_ + 2.0);
              local_180[3] = fVar138 * (auVar205._12_4_ + 3.0);
              fStack_170 = fVar138 * (auVar205._16_4_ + 4.0);
              fStack_16c = fVar138 * (auVar205._20_4_ + 5.0);
              fStack_168 = fVar138 * (auVar205._24_4_ + 6.0);
              fStack_164 = auVar205._28_4_ + 7.0;
              local_380._0_8_ = auVar13._0_8_;
              local_380._8_8_ = auVar13._8_8_;
              local_160 = local_380._0_8_;
              uStack_158 = local_380._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_140 = local_480;
              uVar93 = vmovmskps_avx(auVar134);
              if (uVar93 == 0) goto LAB_0159d1dc;
              lVar99 = 0;
              local_840._0_8_ = ZEXT48(uVar93 & 0xff);
              for (uVar94 = local_840._0_8_; (uVar94 & 1) == 0;
                  uVar94 = uVar94 >> 1 | 0x8000000000000000) {
                lVar99 = lVar99 + 1;
              }
              local_600._0_16_ = CONCAT412(uVar95,CONCAT48(uVar95,CONCAT44(uVar95,uVar95)));
              local_600 = ZEXT1632(local_600._0_16_);
              local_820 = CONCAT44(local_570,local_570);
              uStack_818._0_4_ = local_570;
              uStack_818._4_4_ = local_570;
              local_5c0 = ZEXT1632(*(undefined1 (*) [16])
                                    (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10));
              local_4c0 = ZEXT1632(CONCAT124(auVar16._4_12_,*(undefined4 *)(ray + k * 4 + 0x80)));
              local_5e0 = auVar155;
              local_260 = local_720;
              local_220 = local_480;
              local_1fc = iVar9;
              local_1f0 = local_680;
              uStack_1e8 = uStack_678;
              do {
                local_400 = local_180[lVar99];
                local_700 = (undefined1  [8])lVar99;
                local_3f0 = *(undefined4 *)((long)&local_160 + lVar99 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + lVar99 * 4);
                fVar115 = 1.0 - local_400;
                auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar115 * fVar115)),
                                          ZEXT416((uint)(local_400 * fVar115)),ZEXT416(0xc0000000));
                auVar13 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar115)),
                                          ZEXT416((uint)(local_400 * local_400)),ZEXT416(0x40000000)
                                         );
                fVar138 = auVar13._0_4_ * 3.0;
                fVar114 = local_400 * local_400 * 3.0;
                auVar171._0_4_ = fVar114 * (float)local_530._0_4_;
                auVar171._4_4_ = fVar114 * (float)local_530._4_4_;
                auVar171._8_4_ = fVar114 * fStack_528;
                auVar171._12_4_ = fVar114 * fStack_524;
                auVar141._4_4_ = fVar138;
                auVar141._0_4_ = fVar138;
                auVar141._8_4_ = fVar138;
                auVar141._12_4_ = fVar138;
                auVar13 = vfmadd132ps_fma(auVar141,auVar171,local_670);
                fVar138 = auVar14._0_4_ * 3.0;
                auVar164._4_4_ = fVar138;
                auVar164._0_4_ = fVar138;
                auVar164._8_4_ = fVar138;
                auVar164._12_4_ = fVar138;
                auVar13 = vfmadd132ps_fma(auVar164,auVar13,local_660);
                fVar138 = fVar115 * fVar115 * -3.0;
                local_650.context = context->user;
                auVar142._4_4_ = fVar138;
                auVar142._0_4_ = fVar138;
                auVar142._8_4_ = fVar138;
                auVar142._12_4_ = fVar138;
                auVar87._8_8_ = uStack_678;
                auVar87._0_8_ = local_680;
                auVar13 = vfmadd132ps_fma(auVar142,auVar13,auVar87);
                local_430 = auVar13._0_4_;
                local_420 = vshufps_avx(auVar13,auVar13,0x55);
                local_410 = vshufps_avx(auVar13,auVar13,0xaa);
                local_3e0 = local_820;
                uStack_3d8 = uStack_818;
                local_3d0 = local_600._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_600._0_16_),ZEXT1632(local_600._0_16_));
                uStack_3bc = (local_650.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_650.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_740 = local_5c0._0_16_;
                local_650.valid = (int *)local_740;
                local_650.geometryUserPtr = *(void **)(CONCAT44(uStack_4fc,local_500) + 0x18);
                local_650.hit = (RTCHitN *)&local_430;
                local_650.N = 4;
                pcVar11 = *(code **)(CONCAT44(uStack_4fc,local_500) + 0x48);
                local_650.ray = (RTCRayN *)ray;
                uStack_42c = local_430;
                uStack_428 = local_430;
                uStack_424 = local_430;
                fStack_3fc = local_400;
                fStack_3f8 = local_400;
                fStack_3f4 = local_400;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                if (pcVar11 != (code *)0x0) {
                  (*pcVar11)(&local_650);
                  auVar210 = ZEXT3264(_local_620);
                  auVar136 = ZEXT3264(local_5e0);
                  auVar189 = ZEXT3264(local_6c0);
                  auVar184 = ZEXT3264(CONCAT428(fStack_684,
                                                CONCAT424(fStack_688,
                                                          CONCAT420(fStack_68c,
                                                                    CONCAT416(fStack_690,
                                                                              CONCAT412(fStack_694,
                                                                                        CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
                  auVar205 = ZEXT3264(local_720);
                }
                if (local_740 == (undefined1  [16])0x0) {
                  auVar13 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar13 = auVar13 ^ _DAT_01f7ae20;
                  auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,
                                                  CONCAT416(fVar153,CONCAT412(fVar160,CONCAT48(
                                                  fVar153,uVar101)))))));
                  auVar159 = ZEXT3264(local_6e0);
                }
                else {
                  p_Var12 = context->args->filter;
                  if (p_Var12 == (RTCFilterFunctionN)0x0) {
                    auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,
                                                  CONCAT416(fVar153,CONCAT412(fVar160,CONCAT48(
                                                  fVar153,uVar101)))))));
                    auVar159 = ZEXT3264(local_6e0);
                  }
                  else {
                    auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,
                                                  CONCAT416(fVar153,CONCAT412(fVar160,CONCAT48(
                                                  fVar153,uVar101)))))));
                    auVar159 = ZEXT3264(local_6e0);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       ((*(byte *)(CONCAT44(uStack_4fc,local_500) + 0x3e) & 0x40) != 0)) {
                      (*p_Var12)(&local_650);
                      auVar210 = ZEXT3264(_local_620);
                      auVar136 = ZEXT3264(local_5e0);
                      auVar159 = ZEXT3264(local_6e0);
                      auVar189 = ZEXT3264(local_6c0);
                      auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,
                                                  CONCAT416(fVar153,CONCAT412(fVar160,CONCAT48(
                                                  fVar153,uVar101)))))));
                      auVar184 = ZEXT3264(CONCAT428(fStack_684,
                                                    CONCAT424(fStack_688,
                                                              CONCAT420(fStack_68c,
                                                                        CONCAT416(fStack_690,
                                                                                  CONCAT412(
                                                  fStack_694,
                                                  CONCAT48(fStack_698,CONCAT44(fStack_69c,local_6a0)
                                                          )))))));
                      auVar205 = ZEXT3264(local_720);
                    }
                  }
                  auVar14 = vpcmpeqd_avx(local_740,_DAT_01f7aa10);
                  auVar13 = auVar14 ^ _DAT_01f7ae20;
                  auVar143._8_4_ = 0xff800000;
                  auVar143._0_8_ = 0xff800000ff800000;
                  auVar143._12_4_ = 0xff800000;
                  auVar14 = vblendvps_avx(auVar143,*(undefined1 (*) [16])(local_650.ray + 0x80),
                                          auVar14);
                  *(undefined1 (*) [16])(local_650.ray + 0x80) = auVar14;
                }
                auVar155 = auVar136._0_32_;
                auVar125._8_8_ = 0x100000001;
                auVar125._0_8_ = 0x100000001;
                if ((auVar125 & auVar13) != (undefined1  [16])0x0) {
                  uVar94 = CONCAT71(local_700._1_7_,1);
                  break;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = local_4c0._0_4_;
                uVar94 = 0;
                lVar99 = 0;
                local_840._0_8_ = local_840._0_8_ ^ 1L << ((ulong)local_700 & 0x3f);
                for (uVar97 = local_840._0_8_; (uVar97 & 1) == 0;
                    uVar97 = uVar97 >> 1 | 0x8000000000000000) {
                  lVar99 = lVar99 + 1;
                }
              } while (local_840._0_8_ != 0);
            }
            goto LAB_0159d12b;
          }
          goto LAB_0159d122;
        }
LAB_0159d1dc:
        auVar159 = ZEXT3264(local_6e0);
        uVar94 = 0;
      }
LAB_0159d12b:
      auVar197 = ZEXT3264(auVar197._0_32_);
      uVar95 = (uint)uVar94;
      auVar136 = ZEXT3264(local_5a0);
      if (8 < iVar9) {
        local_340._4_4_ = iVar9;
        local_340._0_4_ = iVar9;
        local_340._8_4_ = iVar9;
        local_340._12_4_ = iVar9;
        local_340._16_4_ = iVar9;
        local_340._20_4_ = iVar9;
        local_340._24_4_ = iVar9;
        local_340._28_4_ = iVar9;
        local_360._4_4_ = fVar139;
        local_360._0_4_ = fVar139;
        fStack_358 = fVar139;
        fStack_354 = fVar139;
        fStack_350 = fVar139;
        fStack_34c = fVar139;
        fStack_348 = fVar139;
        fStack_344 = fVar139;
        local_500 = local_560._0_4_;
        uStack_4fc = local_560._0_4_;
        uStack_4f8 = local_560._0_4_;
        uStack_4f4 = local_560._0_4_;
        uStack_4f0 = local_560._0_4_;
        uStack_4ec = local_560._0_4_;
        uStack_4e8 = local_560._0_4_;
        uStack_4e4 = local_560._0_4_;
        local_120 = 1.0 / (float)local_460._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_290 = (undefined4)local_728;
        uStack_28c = (undefined4)local_728;
        uStack_288 = (undefined4)local_728;
        uStack_284 = (undefined4)local_728;
        uStack_56c = local_570;
        uStack_568 = local_570;
        uStack_564 = local_570;
        lVar99 = 8;
        local_720 = auVar205._0_32_;
        _local_620 = auVar210._0_32_;
        local_5e0 = auVar155;
        do {
          local_600._0_4_ = (int)uVar94;
          auVar192 = auVar197._0_32_;
          local_5a0 = auVar136._0_32_;
          auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 * 4 + lVar22);
          auVar202 = *(undefined1 (*) [32])(lVar22 + 0x21aa768 + lVar99 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar22 + 0x21aabec + lVar99 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar22 + 0x21ab070 + lVar99 * 4);
          fVar119 = *(float *)*pauVar2;
          fVar76 = *(float *)(*pauVar2 + 4);
          fVar77 = *(float *)(*pauVar2 + 8);
          fVar78 = *(float *)(*pauVar2 + 0xc);
          fVar79 = *(float *)(*pauVar2 + 0x10);
          fVar80 = *(float *)(*pauVar2 + 0x14);
          fVar81 = *(float *)(*pauVar2 + 0x18);
          auVar90 = *(undefined1 (*) [28])*pauVar2;
          auVar209._0_4_ = fVar119 * auVar184._0_4_;
          auVar209._4_4_ = fVar76 * auVar184._4_4_;
          auVar209._8_4_ = fVar77 * auVar184._8_4_;
          auVar209._12_4_ = fVar78 * auVar184._12_4_;
          auVar209._16_4_ = fVar79 * auVar184._16_4_;
          auVar209._20_4_ = fVar80 * auVar184._20_4_;
          auVar209._28_36_ = auVar210._28_36_;
          auVar209._24_4_ = fVar81 * auVar184._24_4_;
          auVar197._0_4_ = fVar119 * auVar180._0_4_;
          auVar197._4_4_ = fVar76 * auVar180._4_4_;
          auVar197._8_4_ = fVar77 * auVar180._8_4_;
          auVar197._12_4_ = fVar78 * auVar180._12_4_;
          auVar197._16_4_ = fVar79 * auVar180._16_4_;
          auVar197._20_4_ = fVar80 * auVar180._20_4_;
          auVar197._28_36_ = auVar136._28_36_;
          auVar197._24_4_ = fVar81 * auVar180._24_4_;
          auVar13 = vfmadd231ps_fma(auVar209._0_32_,auVar113,auVar147);
          auVar14 = vfmadd231ps_fma(auVar197._0_32_,auVar113,auVar203);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar202,auVar189._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar202,auVar216);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar134,auVar159._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar134,local_4e0);
          auVar151 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 * 4 + lVar22);
          auVar211 = *(undefined1 (*) [32])(lVar22 + 0x21acb88 + lVar99 * 4);
          auVar7 = *(undefined1 (*) [32])(lVar22 + 0x21ad00c + lVar99 * 4);
          pauVar3 = (undefined1 (*) [32])(lVar22 + 0x21ad490 + lVar99 * 4);
          fVar120 = *(float *)*pauVar3;
          fVar137 = *(float *)(*pauVar3 + 4);
          fVar82 = *(float *)(*pauVar3 + 8);
          fVar83 = *(float *)(*pauVar3 + 0xc);
          fVar84 = *(float *)(*pauVar3 + 0x10);
          fVar85 = *(float *)(*pauVar3 + 0x14);
          fVar86 = *(float *)(*pauVar3 + 0x18);
          auVar91 = *(undefined1 (*) [28])*pauVar3;
          auVar210._0_4_ = fVar120 * auVar184._0_4_;
          auVar210._4_4_ = fVar137 * auVar184._4_4_;
          auVar210._8_4_ = fVar82 * auVar184._8_4_;
          auVar210._12_4_ = fVar83 * auVar184._12_4_;
          auVar210._16_4_ = fVar84 * auVar184._16_4_;
          auVar210._20_4_ = fVar85 * auVar184._20_4_;
          auVar210._28_36_ = auVar184._28_36_;
          auVar210._24_4_ = fVar86 * auVar184._24_4_;
          auVar46._4_4_ = fVar137 * auVar180._4_4_;
          auVar46._0_4_ = fVar120 * auVar180._0_4_;
          auVar46._8_4_ = fVar82 * auVar180._8_4_;
          auVar46._12_4_ = fVar83 * auVar180._12_4_;
          auVar46._16_4_ = fVar84 * auVar180._16_4_;
          auVar46._20_4_ = fVar85 * auVar180._20_4_;
          auVar46._24_4_ = fVar86 * auVar180._24_4_;
          auVar46._28_4_ = auVar134._28_4_;
          auVar15 = vfmadd231ps_fma(auVar210._0_32_,auVar7,auVar147);
          auVar16 = vfmadd231ps_fma(auVar46,auVar7,auVar203);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar211,auVar189._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar211,auVar216);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar151,auVar159._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar151,local_4e0);
          local_2e0 = ZEXT1632(auVar15);
          local_4c0 = ZEXT1632(auVar13);
          auVar187 = vsubps_avx(local_2e0,local_4c0);
          auVar150 = ZEXT1632(auVar16);
          local_560 = ZEXT1632(auVar14);
          local_2c0 = vsubps_avx(auVar150,local_560);
          auVar47._4_4_ = auVar187._4_4_ * auVar14._4_4_;
          auVar47._0_4_ = auVar187._0_4_ * auVar14._0_4_;
          auVar47._8_4_ = auVar187._8_4_ * auVar14._8_4_;
          auVar47._12_4_ = auVar187._12_4_ * auVar14._12_4_;
          auVar47._16_4_ = auVar187._16_4_ * 0.0;
          auVar47._20_4_ = auVar187._20_4_ * 0.0;
          auVar47._24_4_ = auVar187._24_4_ * 0.0;
          auVar47._28_4_ = auVar7._28_4_;
          fVar139 = local_2c0._0_4_;
          auVar133._0_4_ = auVar13._0_4_ * fVar139;
          fVar138 = local_2c0._4_4_;
          auVar133._4_4_ = auVar13._4_4_ * fVar138;
          fVar114 = local_2c0._8_4_;
          auVar133._8_4_ = auVar13._8_4_ * fVar114;
          fVar115 = local_2c0._12_4_;
          auVar133._12_4_ = auVar13._12_4_ * fVar115;
          fVar116 = local_2c0._16_4_;
          auVar133._16_4_ = fVar116 * 0.0;
          fVar117 = local_2c0._20_4_;
          auVar133._20_4_ = fVar117 * 0.0;
          fVar118 = local_2c0._24_4_;
          auVar133._24_4_ = fVar118 * 0.0;
          auVar133._28_4_ = 0;
          auVar210 = ZEXT3264(auVar113);
          auVar107 = vsubps_avx(auVar47,auVar133);
          auVar136._0_4_ = fVar119 * (float)local_e0;
          auVar136._4_4_ = fVar76 * local_e0._4_4_;
          auVar136._8_4_ = fVar77 * (float)uStack_d8;
          auVar136._12_4_ = fVar78 * uStack_d8._4_4_;
          auVar136._16_4_ = fVar79 * (float)uStack_d0;
          auVar136._20_4_ = fVar80 * uStack_d0._4_4_;
          auVar136._28_36_ = auVar180._28_36_;
          auVar136._24_4_ = fVar81 * (float)uStack_c8;
          auVar13 = vfmadd231ps_fma(auVar136._0_32_,auVar113,local_c0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar202,local_a0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_80,auVar134);
          auVar48._4_4_ = fVar137 * local_e0._4_4_;
          auVar48._0_4_ = fVar120 * (float)local_e0;
          auVar48._8_4_ = fVar82 * (float)uStack_d8;
          auVar48._12_4_ = fVar83 * uStack_d8._4_4_;
          auVar48._16_4_ = fVar84 * (float)uStack_d0;
          auVar48._20_4_ = fVar85 * uStack_d0._4_4_;
          auVar48._24_4_ = fVar86 * (float)uStack_c8;
          auVar48._28_4_ = uStack_c8._4_4_;
          auVar14 = vfmadd231ps_fma(auVar48,auVar7,local_c0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar211,local_a0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar151,local_80);
          auVar49._4_4_ = fVar138 * fVar138;
          auVar49._0_4_ = fVar139 * fVar139;
          auVar49._8_4_ = fVar114 * fVar114;
          auVar49._12_4_ = fVar115 * fVar115;
          auVar49._16_4_ = fVar116 * fVar116;
          auVar49._20_4_ = fVar117 * fVar117;
          auVar49._24_4_ = fVar118 * fVar118;
          auVar49._28_4_ = local_80._28_4_;
          auVar15 = vfmadd231ps_fma(auVar49,auVar187,auVar187);
          auVar196 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
          auVar193._0_4_ = auVar196._0_4_ * auVar196._0_4_ * auVar15._0_4_;
          auVar193._4_4_ = auVar196._4_4_ * auVar196._4_4_ * auVar15._4_4_;
          auVar193._8_4_ = auVar196._8_4_ * auVar196._8_4_ * auVar15._8_4_;
          auVar193._12_4_ = auVar196._12_4_ * auVar196._12_4_ * auVar15._12_4_;
          auVar193._16_4_ = auVar196._16_4_ * auVar196._16_4_ * 0.0;
          auVar193._20_4_ = auVar196._20_4_ * auVar196._20_4_ * 0.0;
          auVar193._24_4_ = auVar196._24_4_ * auVar196._24_4_ * 0.0;
          auVar193._28_4_ = 0;
          auVar50._4_4_ = auVar107._4_4_ * auVar107._4_4_;
          auVar50._0_4_ = auVar107._0_4_ * auVar107._0_4_;
          auVar50._8_4_ = auVar107._8_4_ * auVar107._8_4_;
          auVar50._12_4_ = auVar107._12_4_ * auVar107._12_4_;
          auVar50._16_4_ = auVar107._16_4_ * auVar107._16_4_;
          auVar50._20_4_ = auVar107._20_4_ * auVar107._20_4_;
          auVar50._24_4_ = auVar107._24_4_ * auVar107._24_4_;
          auVar50._28_4_ = auVar107._28_4_;
          auVar196 = vcmpps_avx(auVar50,auVar193,2);
          local_200 = (int)lVar99;
          auVar194._4_4_ = local_200;
          auVar194._0_4_ = local_200;
          auVar194._8_4_ = local_200;
          auVar194._12_4_ = local_200;
          auVar194._16_4_ = local_200;
          auVar194._20_4_ = local_200;
          auVar194._24_4_ = local_200;
          auVar194._28_4_ = local_200;
          auVar107 = vpor_avx2(auVar194,_DAT_01fe9900);
          auVar21 = vpcmpgtd_avx2(local_340,auVar107);
          auVar107 = auVar21 & auVar196;
          if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar107 >> 0x7f,0) == '\0') &&
                (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0xbf,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar107[0x1f]) {
            auVar136 = ZEXT3264(local_5a0);
            auVar197 = ZEXT3264(auVar192);
            auVar184 = ZEXT3264(CONCAT428(fStack_684,
                                          CONCAT424(fStack_688,
                                                    CONCAT420(fStack_68c,
                                                              CONCAT416(fStack_690,
                                                                        CONCAT412(fStack_694,
                                                                                  CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
            auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,CONCAT416(
                                                  fVar153,CONCAT412(fVar160,CONCAT48(fVar153,uVar101
                                                                                    )))))));
            auVar189 = ZEXT3264(local_6c0);
            uVar94 = uVar94 & 0xffffffff;
          }
          else {
            local_460 = vandps_avx(auVar21,auVar196);
            local_320._0_4_ = auVar91._0_4_;
            local_320._4_4_ = auVar91._4_4_;
            fStack_318 = auVar91._8_4_;
            fStack_314 = auVar91._12_4_;
            fStack_310 = auVar91._16_4_;
            fStack_30c = auVar91._20_4_;
            fStack_308 = auVar91._24_4_;
            auVar51._4_4_ = (float)local_620._4_4_ * (float)local_320._4_4_;
            auVar51._0_4_ = (float)local_620._0_4_ * (float)local_320._0_4_;
            auVar51._8_4_ = fStack_618 * fStack_318;
            auVar51._12_4_ = fStack_614 * fStack_314;
            auVar51._16_4_ = fStack_610 * fStack_310;
            auVar51._20_4_ = fStack_60c * fStack_30c;
            auVar51._24_4_ = fStack_608 * fStack_308;
            auVar51._28_4_ = auVar196._28_4_;
            auVar15 = vfmadd213ps_fma(auVar7,local_4a0,auVar51);
            auVar15 = vfmadd213ps_fma(auVar211,local_100,ZEXT1632(auVar15));
            auVar15 = vfmadd132ps_fma(auVar151,ZEXT1632(auVar15),local_5e0);
            local_300._0_4_ = auVar90._0_4_;
            local_300._4_4_ = auVar90._4_4_;
            fStack_2f8 = auVar90._8_4_;
            fStack_2f4 = auVar90._12_4_;
            fStack_2f0 = auVar90._16_4_;
            fStack_2ec = auVar90._20_4_;
            fStack_2e8 = auVar90._24_4_;
            auVar156._0_4_ = (float)local_620._0_4_ * (float)local_300._0_4_;
            auVar156._4_4_ = (float)local_620._4_4_ * (float)local_300._4_4_;
            auVar156._8_4_ = fStack_618 * fStack_2f8;
            auVar156._12_4_ = fStack_614 * fStack_2f4;
            auVar156._16_4_ = fStack_610 * fStack_2f0;
            auVar156._20_4_ = fStack_60c * fStack_2ec;
            auVar156._24_4_ = fStack_608 * fStack_2e8;
            auVar156._28_4_ = 0;
            auVar17 = vfmadd213ps_fma(auVar113,local_4a0,auVar156);
            auVar17 = vfmadd213ps_fma(auVar202,local_100,ZEXT1632(auVar17));
            auVar202 = *(undefined1 (*) [32])(lVar22 + 0x21ab4f4 + lVar99 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar22 + 0x21ab978 + lVar99 * 4);
            auVar151 = *(undefined1 (*) [32])(lVar22 + 0x21abdfc + lVar99 * 4);
            pfVar4 = (float *)(lVar22 + 0x21ac280 + lVar99 * 4);
            fVar139 = *pfVar4;
            fVar138 = pfVar4[1];
            fVar114 = pfVar4[2];
            fVar115 = pfVar4[3];
            fVar116 = pfVar4[4];
            fVar117 = pfVar4[5];
            fVar118 = pfVar4[6];
            auVar52._4_4_ = fStack_69c * fVar138;
            auVar52._0_4_ = local_6a0 * fVar139;
            auVar52._8_4_ = fStack_698 * fVar114;
            auVar52._12_4_ = fStack_694 * fVar115;
            auVar52._16_4_ = fStack_690 * fVar116;
            auVar52._20_4_ = fStack_68c * fVar117;
            auVar52._24_4_ = fStack_688 * fVar118;
            auVar52._28_4_ = auVar187._28_4_;
            auVar207._0_4_ = fVar153 * fVar139;
            auVar207._4_4_ = fVar160 * fVar138;
            auVar207._8_4_ = fVar153 * fVar114;
            auVar207._12_4_ = fVar160 * fVar115;
            auVar207._16_4_ = fVar153 * fVar116;
            auVar207._20_4_ = fVar160 * fVar117;
            auVar207._24_4_ = fVar153 * fVar118;
            auVar207._28_4_ = 0;
            auVar53._4_4_ = fVar138 * (float)local_620._4_4_;
            auVar53._0_4_ = fVar139 * (float)local_620._0_4_;
            auVar53._8_4_ = fVar114 * fStack_618;
            auVar53._12_4_ = fVar115 * fStack_614;
            auVar53._16_4_ = fVar116 * fStack_610;
            auVar53._20_4_ = fVar117 * fStack_60c;
            auVar53._24_4_ = fVar118 * fStack_608;
            auVar53._28_4_ = pfVar4[7];
            auVar18 = vfmadd231ps_fma(auVar52,auVar151,auVar147);
            auVar105 = vfmadd231ps_fma(auVar207,auVar151,auVar203);
            auVar104 = vfmadd231ps_fma(auVar53,local_4a0,auVar151);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar113,local_6c0);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar113,auVar216);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_100,auVar113);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar202,local_6e0);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar202,local_4e0);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_5e0,auVar202);
            pfVar4 = (float *)(lVar22 + 0x21ae6a0 + lVar99 * 4);
            fVar139 = *pfVar4;
            fVar138 = pfVar4[1];
            fVar114 = pfVar4[2];
            fVar115 = pfVar4[3];
            fVar116 = pfVar4[4];
            fVar117 = pfVar4[5];
            fVar118 = pfVar4[6];
            auVar54._4_4_ = fStack_69c * fVar138;
            auVar54._0_4_ = local_6a0 * fVar139;
            auVar54._8_4_ = fStack_698 * fVar114;
            auVar54._12_4_ = fStack_694 * fVar115;
            auVar54._16_4_ = fStack_690 * fVar116;
            auVar54._20_4_ = fStack_68c * fVar117;
            auVar54._24_4_ = fStack_688 * fVar118;
            auVar54._28_4_ = fStack_684;
            auVar55._4_4_ = fVar160 * fVar138;
            auVar55._0_4_ = fVar153 * fVar139;
            auVar55._8_4_ = fVar153 * fVar114;
            auVar55._12_4_ = fVar160 * fVar115;
            auVar55._16_4_ = fVar153 * fVar116;
            auVar55._20_4_ = fVar160 * fVar117;
            auVar55._24_4_ = fVar153 * fVar118;
            auVar55._28_4_ = fVar160;
            auVar56._4_4_ = (float)local_620._4_4_ * fVar138;
            auVar56._0_4_ = (float)local_620._0_4_ * fVar139;
            auVar56._8_4_ = fStack_618 * fVar114;
            auVar56._12_4_ = fStack_614 * fVar115;
            auVar56._16_4_ = fStack_610 * fVar116;
            auVar56._20_4_ = fStack_60c * fVar117;
            auVar56._24_4_ = fStack_608 * fVar118;
            auVar56._28_4_ = pfVar4[7];
            auVar202 = *(undefined1 (*) [32])(lVar22 + 0x21ae21c + lVar99 * 4);
            auVar140 = vfmadd231ps_fma(auVar54,auVar202,auVar147);
            auVar123 = vfmadd231ps_fma(auVar55,auVar202,auVar203);
            auVar103 = vfmadd231ps_fma(auVar56,local_4a0,auVar202);
            auVar202 = *(undefined1 (*) [32])(lVar22 + 0x21add98 + lVar99 * 4);
            auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar202,local_6c0);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar202,auVar216);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_100,auVar202);
            auVar202 = *(undefined1 (*) [32])(lVar22 + 0x21ad914 + lVar99 * 4);
            auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar202,local_6e0);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar202,local_4e0);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_5e0,auVar202);
            auVar195._8_4_ = 0x7fffffff;
            auVar195._0_8_ = 0x7fffffff7fffffff;
            auVar195._12_4_ = 0x7fffffff;
            auVar195._16_4_ = 0x7fffffff;
            auVar195._20_4_ = 0x7fffffff;
            auVar195._24_4_ = 0x7fffffff;
            auVar195._28_4_ = 0x7fffffff;
            auVar202 = vandps_avx(ZEXT1632(auVar18),auVar195);
            auVar113 = vandps_avx(ZEXT1632(auVar105),auVar195);
            auVar113 = vmaxps_avx(auVar202,auVar113);
            auVar202 = vandps_avx(ZEXT1632(auVar104),auVar195);
            auVar202 = vmaxps_avx(auVar113,auVar202);
            auVar202 = vcmpps_avx(auVar202,_local_360,1);
            auVar151 = vblendvps_avx(ZEXT1632(auVar18),auVar187,auVar202);
            auVar211 = vblendvps_avx(ZEXT1632(auVar105),local_2c0,auVar202);
            auVar202 = vandps_avx(ZEXT1632(auVar140),auVar195);
            auVar113 = vandps_avx(ZEXT1632(auVar123),auVar195);
            auVar113 = vmaxps_avx(auVar202,auVar113);
            auVar202 = vandps_avx(auVar195,ZEXT1632(auVar103));
            auVar202 = vmaxps_avx(auVar113,auVar202);
            auVar113 = vcmpps_avx(auVar202,_local_360,1);
            auVar202 = vblendvps_avx(ZEXT1632(auVar140),auVar187,auVar113);
            auVar113 = vblendvps_avx(ZEXT1632(auVar123),local_2c0,auVar113);
            auVar17 = vfmadd213ps_fma(auVar134,local_5e0,ZEXT1632(auVar17));
            auVar18 = vfmadd213ps_fma(auVar151,auVar151,ZEXT832(0) << 0x20);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar211,auVar211);
            auVar134 = vrsqrtps_avx(ZEXT1632(auVar18));
            fVar139 = auVar134._0_4_;
            fVar138 = auVar134._4_4_;
            fVar114 = auVar134._8_4_;
            fVar115 = auVar134._12_4_;
            fVar116 = auVar134._16_4_;
            fVar117 = auVar134._20_4_;
            fVar118 = auVar134._24_4_;
            auVar57._4_4_ = fVar138 * fVar138 * fVar138 * auVar18._4_4_ * -0.5;
            auVar57._0_4_ = fVar139 * fVar139 * fVar139 * auVar18._0_4_ * -0.5;
            auVar57._8_4_ = fVar114 * fVar114 * fVar114 * auVar18._8_4_ * -0.5;
            auVar57._12_4_ = fVar115 * fVar115 * fVar115 * auVar18._12_4_ * -0.5;
            auVar57._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar57._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
            auVar57._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
            auVar57._28_4_ = 0;
            auVar215._8_4_ = 0x3fc00000;
            auVar215._0_8_ = 0x3fc000003fc00000;
            auVar215._12_4_ = 0x3fc00000;
            auVar215._16_4_ = 0x3fc00000;
            auVar215._20_4_ = 0x3fc00000;
            auVar215._24_4_ = 0x3fc00000;
            auVar215._28_4_ = 0x3fc00000;
            auVar18 = vfmadd231ps_fma(auVar57,auVar215,auVar134);
            fVar139 = auVar18._0_4_;
            fVar138 = auVar18._4_4_;
            auVar58._4_4_ = auVar211._4_4_ * fVar138;
            auVar58._0_4_ = auVar211._0_4_ * fVar139;
            fVar114 = auVar18._8_4_;
            auVar58._8_4_ = auVar211._8_4_ * fVar114;
            fVar115 = auVar18._12_4_;
            auVar58._12_4_ = auVar211._12_4_ * fVar115;
            auVar58._16_4_ = auVar211._16_4_ * 0.0;
            auVar58._20_4_ = auVar211._20_4_ * 0.0;
            auVar58._24_4_ = auVar211._24_4_ * 0.0;
            auVar58._28_4_ = auVar134._28_4_;
            auVar59._4_4_ = fVar138 * -auVar151._4_4_;
            auVar59._0_4_ = fVar139 * -auVar151._0_4_;
            auVar59._8_4_ = fVar114 * -auVar151._8_4_;
            auVar59._12_4_ = fVar115 * -auVar151._12_4_;
            auVar59._16_4_ = -auVar151._16_4_ * 0.0;
            auVar59._20_4_ = -auVar151._20_4_ * 0.0;
            auVar59._24_4_ = -auVar151._24_4_ * 0.0;
            auVar59._28_4_ = auVar211._28_4_;
            auVar18 = vfmadd213ps_fma(auVar202,auVar202,ZEXT832(0) << 0x20);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar113,auVar113);
            auVar134 = vrsqrtps_avx(ZEXT1632(auVar18));
            auVar60._28_4_ = auVar187._28_4_;
            auVar60._0_28_ =
                 ZEXT1628(CONCAT412(fVar115 * 0.0,
                                    CONCAT48(fVar114 * 0.0,CONCAT44(fVar138 * 0.0,fVar139 * 0.0))));
            fVar139 = auVar134._0_4_;
            fVar138 = auVar134._4_4_;
            fVar114 = auVar134._8_4_;
            fVar115 = auVar134._12_4_;
            fVar116 = auVar134._16_4_;
            fVar117 = auVar134._20_4_;
            fVar118 = auVar134._24_4_;
            auVar61._4_4_ = fVar138 * fVar138 * fVar138 * auVar18._4_4_ * -0.5;
            auVar61._0_4_ = fVar139 * fVar139 * fVar139 * auVar18._0_4_ * -0.5;
            auVar61._8_4_ = fVar114 * fVar114 * fVar114 * auVar18._8_4_ * -0.5;
            auVar61._12_4_ = fVar115 * fVar115 * fVar115 * auVar18._12_4_ * -0.5;
            auVar61._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar61._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
            auVar61._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
            auVar61._28_4_ = 0;
            auVar18 = vfmadd231ps_fma(auVar61,auVar215,auVar134);
            fVar139 = auVar18._0_4_;
            fVar138 = auVar18._4_4_;
            auVar62._4_4_ = auVar113._4_4_ * fVar138;
            auVar62._0_4_ = auVar113._0_4_ * fVar139;
            fVar114 = auVar18._8_4_;
            auVar62._8_4_ = auVar113._8_4_ * fVar114;
            fVar115 = auVar18._12_4_;
            auVar62._12_4_ = auVar113._12_4_ * fVar115;
            auVar62._16_4_ = auVar113._16_4_ * 0.0;
            auVar62._20_4_ = auVar113._20_4_ * 0.0;
            auVar62._24_4_ = auVar113._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar63._4_4_ = fVar138 * -auVar202._4_4_;
            auVar63._0_4_ = fVar139 * -auVar202._0_4_;
            auVar63._8_4_ = fVar114 * -auVar202._8_4_;
            auVar63._12_4_ = fVar115 * -auVar202._12_4_;
            auVar63._16_4_ = -auVar202._16_4_ * 0.0;
            auVar63._20_4_ = -auVar202._20_4_ * 0.0;
            auVar63._24_4_ = -auVar202._24_4_ * 0.0;
            auVar63._28_4_ = auVar134._28_4_;
            auVar64._28_4_ = 0xbf000000;
            auVar64._0_28_ =
                 ZEXT1628(CONCAT412(fVar115 * 0.0,
                                    CONCAT48(fVar114 * 0.0,CONCAT44(fVar138 * 0.0,fVar139 * 0.0))));
            auVar18 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar13),local_4c0);
            auVar134 = ZEXT1632(auVar13);
            auVar105 = vfmadd213ps_fma(auVar59,auVar134,local_560);
            auVar104 = vfmadd213ps_fma(auVar60,auVar134,ZEXT1632(auVar17));
            auVar124 = vfnmadd213ps_fma(auVar58,auVar134,local_4c0);
            auVar140 = vfmadd213ps_fma(auVar62,ZEXT1632(auVar14),local_2e0);
            auVar154 = vfnmadd213ps_fma(auVar59,auVar134,local_560);
            auVar134 = ZEXT1632(auVar14);
            auVar123 = vfmadd213ps_fma(auVar63,auVar134,auVar150);
            auVar127 = ZEXT1632(auVar13);
            auVar122 = vfnmadd231ps_fma(ZEXT1632(auVar17),auVar127,auVar60);
            auVar17 = vfmadd213ps_fma(auVar64,auVar134,ZEXT1632(auVar15));
            auVar162 = vfnmadd213ps_fma(auVar62,auVar134,local_2e0);
            auVar102 = vfnmadd213ps_fma(auVar63,auVar134,auVar150);
            auVar161 = vfnmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar14),auVar64);
            auVar134 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar154));
            auVar202 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar122));
            auVar178._0_4_ = auVar134._0_4_ * auVar122._0_4_;
            auVar178._4_4_ = auVar134._4_4_ * auVar122._4_4_;
            auVar178._8_4_ = auVar134._8_4_ * auVar122._8_4_;
            auVar178._12_4_ = auVar134._12_4_ * auVar122._12_4_;
            auVar178._16_4_ = auVar134._16_4_ * 0.0;
            auVar178._20_4_ = auVar134._20_4_ * 0.0;
            auVar178._24_4_ = auVar134._24_4_ * 0.0;
            auVar178._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar178,ZEXT1632(auVar154),auVar202);
            auVar65._4_4_ = auVar124._4_4_ * auVar202._4_4_;
            auVar65._0_4_ = auVar124._0_4_ * auVar202._0_4_;
            auVar65._8_4_ = auVar124._8_4_ * auVar202._8_4_;
            auVar65._12_4_ = auVar124._12_4_ * auVar202._12_4_;
            auVar65._16_4_ = auVar202._16_4_ * 0.0;
            auVar65._20_4_ = auVar202._20_4_ * 0.0;
            auVar65._24_4_ = auVar202._24_4_ * 0.0;
            auVar65._28_4_ = auVar202._28_4_;
            auVar196 = ZEXT1632(auVar124);
            auVar202 = vsubps_avx(ZEXT1632(auVar140),auVar196);
            auVar107 = ZEXT1632(auVar122);
            auVar15 = vfmsub231ps_fma(auVar65,auVar107,auVar202);
            auVar66._4_4_ = auVar154._4_4_ * auVar202._4_4_;
            auVar66._0_4_ = auVar154._0_4_ * auVar202._0_4_;
            auVar66._8_4_ = auVar154._8_4_ * auVar202._8_4_;
            auVar66._12_4_ = auVar154._12_4_ * auVar202._12_4_;
            auVar66._16_4_ = auVar202._16_4_ * 0.0;
            auVar66._20_4_ = auVar202._20_4_ * 0.0;
            auVar66._24_4_ = auVar202._24_4_ * 0.0;
            auVar66._28_4_ = auVar202._28_4_;
            auVar124 = vfmsub231ps_fma(auVar66,auVar196,auVar134);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar124),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar103));
            auVar21 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,2);
            auVar134 = vblendvps_avx(ZEXT1632(auVar162),ZEXT1632(auVar18),auVar21);
            auVar202 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar105),auVar21);
            auVar113 = vblendvps_avx(ZEXT1632(auVar161),ZEXT1632(auVar104),auVar21);
            auVar151 = vblendvps_avx(auVar196,ZEXT1632(auVar140),auVar21);
            auVar211 = vblendvps_avx(ZEXT1632(auVar154),ZEXT1632(auVar123),auVar21);
            auVar7 = vblendvps_avx(auVar107,ZEXT1632(auVar17),auVar21);
            auVar196 = vblendvps_avx(ZEXT1632(auVar140),auVar196,auVar21);
            auVar187 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar154),auVar21);
            auVar15 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
            auVar107 = vblendvps_avx(ZEXT1632(auVar17),auVar107,auVar21);
            auVar196 = vsubps_avx(auVar196,auVar134);
            auVar187 = vsubps_avx(auVar187,auVar202);
            auVar150 = vsubps_avx(auVar107,auVar113);
            auVar19 = vsubps_avx(auVar134,auVar151);
            auVar20 = vsubps_avx(auVar202,auVar211);
            auVar108 = vsubps_avx(auVar113,auVar7);
            auVar173._0_4_ = auVar150._0_4_ * auVar134._0_4_;
            auVar173._4_4_ = auVar150._4_4_ * auVar134._4_4_;
            auVar173._8_4_ = auVar150._8_4_ * auVar134._8_4_;
            auVar173._12_4_ = auVar150._12_4_ * auVar134._12_4_;
            auVar173._16_4_ = auVar150._16_4_ * auVar134._16_4_;
            auVar173._20_4_ = auVar150._20_4_ * auVar134._20_4_;
            auVar173._24_4_ = auVar150._24_4_ * auVar134._24_4_;
            auVar173._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar173,auVar113,auVar196);
            auVar67._4_4_ = auVar196._4_4_ * auVar202._4_4_;
            auVar67._0_4_ = auVar196._0_4_ * auVar202._0_4_;
            auVar67._8_4_ = auVar196._8_4_ * auVar202._8_4_;
            auVar67._12_4_ = auVar196._12_4_ * auVar202._12_4_;
            auVar67._16_4_ = auVar196._16_4_ * auVar202._16_4_;
            auVar67._20_4_ = auVar196._20_4_ * auVar202._20_4_;
            auVar67._24_4_ = auVar196._24_4_ * auVar202._24_4_;
            auVar67._28_4_ = auVar107._28_4_;
            auVar18 = vfmsub231ps_fma(auVar67,auVar134,auVar187);
            auVar210 = ZEXT864(0) << 0x20;
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar174._0_4_ = auVar187._0_4_ * auVar113._0_4_;
            auVar174._4_4_ = auVar187._4_4_ * auVar113._4_4_;
            auVar174._8_4_ = auVar187._8_4_ * auVar113._8_4_;
            auVar174._12_4_ = auVar187._12_4_ * auVar113._12_4_;
            auVar174._16_4_ = auVar187._16_4_ * auVar113._16_4_;
            auVar174._20_4_ = auVar187._20_4_ * auVar113._20_4_;
            auVar174._24_4_ = auVar187._24_4_ * auVar113._24_4_;
            auVar174._28_4_ = 0;
            auVar18 = vfmsub231ps_fma(auVar174,auVar202,auVar150);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
            auVar175._0_4_ = auVar108._0_4_ * auVar151._0_4_;
            auVar175._4_4_ = auVar108._4_4_ * auVar151._4_4_;
            auVar175._8_4_ = auVar108._8_4_ * auVar151._8_4_;
            auVar175._12_4_ = auVar108._12_4_ * auVar151._12_4_;
            auVar175._16_4_ = auVar108._16_4_ * auVar151._16_4_;
            auVar175._20_4_ = auVar108._20_4_ * auVar151._20_4_;
            auVar175._24_4_ = auVar108._24_4_ * auVar151._24_4_;
            auVar175._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar175,auVar19,auVar7);
            auVar68._4_4_ = auVar20._4_4_ * auVar7._4_4_;
            auVar68._0_4_ = auVar20._0_4_ * auVar7._0_4_;
            auVar68._8_4_ = auVar20._8_4_ * auVar7._8_4_;
            auVar68._12_4_ = auVar20._12_4_ * auVar7._12_4_;
            auVar68._16_4_ = auVar20._16_4_ * auVar7._16_4_;
            auVar68._20_4_ = auVar20._20_4_ * auVar7._20_4_;
            auVar68._24_4_ = auVar20._24_4_ * auVar7._24_4_;
            auVar68._28_4_ = auVar7._28_4_;
            auVar105 = vfmsub231ps_fma(auVar68,auVar211,auVar108);
            auVar69._4_4_ = auVar19._4_4_ * auVar211._4_4_;
            auVar69._0_4_ = auVar19._0_4_ * auVar211._0_4_;
            auVar69._8_4_ = auVar19._8_4_ * auVar211._8_4_;
            auVar69._12_4_ = auVar19._12_4_ * auVar211._12_4_;
            auVar69._16_4_ = auVar19._16_4_ * auVar211._16_4_;
            auVar69._20_4_ = auVar19._20_4_ * auVar211._20_4_;
            auVar69._24_4_ = auVar19._24_4_ * auVar211._24_4_;
            auVar69._28_4_ = auVar211._28_4_;
            auVar104 = vfmsub231ps_fma(auVar69,auVar20,auVar151);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
            auVar151 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar105));
            auVar151 = vcmpps_avx(auVar151,ZEXT832(0) << 0x20,2);
            auVar17 = vpackssdw_avx(auVar151._0_16_,auVar151._16_16_);
            auVar17 = vpand_avx(auVar17,auVar15);
            auVar151 = vpmovsxwd_avx2(auVar17);
            if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar151 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar151 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar151 >> 0x7f,0) == '\0') &&
                  (auVar151 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar151 >> 0xbf,0) == '\0') &&
                (auVar151 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar151[0x1f]) {
              auVar158._8_8_ = uStack_518;
              auVar158._0_8_ = local_520;
              auVar158._16_8_ = uStack_510;
              auVar158._24_8_ = uStack_508;
              auVar197 = ZEXT3264(auVar192);
            }
            else {
              auVar70._4_4_ = auVar187._4_4_ * auVar108._4_4_;
              auVar70._0_4_ = auVar187._0_4_ * auVar108._0_4_;
              auVar70._8_4_ = auVar187._8_4_ * auVar108._8_4_;
              auVar70._12_4_ = auVar187._12_4_ * auVar108._12_4_;
              auVar70._16_4_ = auVar187._16_4_ * auVar108._16_4_;
              auVar70._20_4_ = auVar187._20_4_ * auVar108._20_4_;
              auVar70._24_4_ = auVar187._24_4_ * auVar108._24_4_;
              auVar70._28_4_ = auVar151._28_4_;
              auVar103 = vfmsub231ps_fma(auVar70,auVar20,auVar150);
              auVar179._0_4_ = auVar19._0_4_ * auVar150._0_4_;
              auVar179._4_4_ = auVar19._4_4_ * auVar150._4_4_;
              auVar179._8_4_ = auVar19._8_4_ * auVar150._8_4_;
              auVar179._12_4_ = auVar19._12_4_ * auVar150._12_4_;
              auVar179._16_4_ = auVar19._16_4_ * auVar150._16_4_;
              auVar179._20_4_ = auVar19._20_4_ * auVar150._20_4_;
              auVar179._24_4_ = auVar19._24_4_ * auVar150._24_4_;
              auVar179._28_4_ = 0;
              auVar123 = vfmsub231ps_fma(auVar179,auVar196,auVar108);
              auVar71._4_4_ = auVar196._4_4_ * auVar20._4_4_;
              auVar71._0_4_ = auVar196._0_4_ * auVar20._0_4_;
              auVar71._8_4_ = auVar196._8_4_ * auVar20._8_4_;
              auVar71._12_4_ = auVar196._12_4_ * auVar20._12_4_;
              auVar71._16_4_ = auVar196._16_4_ * auVar20._16_4_;
              auVar71._20_4_ = auVar196._20_4_ * auVar20._20_4_;
              auVar71._24_4_ = auVar196._24_4_ * auVar20._24_4_;
              auVar71._28_4_ = auVar20._28_4_;
              auVar124 = vfmsub231ps_fma(auVar71,auVar19,auVar187);
              auVar104 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar123),ZEXT1632(auVar124));
              auVar140 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT1632(auVar103),ZEXT832(0) << 0x20);
              auVar151 = vrcpps_avx(ZEXT1632(auVar140));
              auVar208._8_4_ = 0x3f800000;
              auVar208._0_8_ = 0x3f8000003f800000;
              auVar208._12_4_ = 0x3f800000;
              auVar208._16_4_ = 0x3f800000;
              auVar208._20_4_ = 0x3f800000;
              auVar208._24_4_ = 0x3f800000;
              auVar208._28_4_ = 0x3f800000;
              auVar210 = ZEXT3264(auVar208);
              auVar104 = vfnmadd213ps_fma(auVar151,ZEXT1632(auVar140),auVar208);
              auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar151,auVar151);
              auVar72._4_4_ = auVar124._4_4_ * auVar113._4_4_;
              auVar72._0_4_ = auVar124._0_4_ * auVar113._0_4_;
              auVar72._8_4_ = auVar124._8_4_ * auVar113._8_4_;
              auVar72._12_4_ = auVar124._12_4_ * auVar113._12_4_;
              auVar72._16_4_ = auVar113._16_4_ * 0.0;
              auVar72._20_4_ = auVar113._20_4_ * 0.0;
              auVar72._24_4_ = auVar113._24_4_ * 0.0;
              auVar72._28_4_ = auVar113._28_4_;
              auVar123 = vfmadd231ps_fma(auVar72,ZEXT1632(auVar123),auVar202);
              auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT1632(auVar103),auVar134);
              fVar139 = auVar104._0_4_;
              fVar138 = auVar104._4_4_;
              fVar114 = auVar104._8_4_;
              fVar115 = auVar104._12_4_;
              auVar113 = ZEXT1632(CONCAT412(fVar115 * auVar123._12_4_,
                                            CONCAT48(fVar114 * auVar123._8_4_,
                                                     CONCAT44(fVar138 * auVar123._4_4_,
                                                              fVar139 * auVar123._0_4_))));
              uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar157._4_4_ = uVar100;
              auVar157._0_4_ = uVar100;
              auVar157._8_4_ = uVar100;
              auVar157._12_4_ = uVar100;
              auVar157._16_4_ = uVar100;
              auVar157._20_4_ = uVar100;
              auVar157._24_4_ = uVar100;
              auVar157._28_4_ = uVar100;
              auVar89._4_4_ = uStack_4fc;
              auVar89._0_4_ = local_500;
              auVar89._8_4_ = uStack_4f8;
              auVar89._12_4_ = uStack_4f4;
              auVar89._16_4_ = uStack_4f0;
              auVar89._20_4_ = uStack_4ec;
              auVar89._24_4_ = uStack_4e8;
              auVar89._28_4_ = uStack_4e4;
              auVar134 = vcmpps_avx(auVar89,auVar113,2);
              auVar202 = vcmpps_avx(auVar113,auVar157,2);
              auVar134 = vandps_avx(auVar202,auVar134);
              auVar104 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
              auVar17 = vpand_avx(auVar17,auVar104);
              auVar134 = vpmovsxwd_avx2(auVar17);
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar134 >> 0x7f,0) == '\0') &&
                    (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar134 >> 0xbf,0) == '\0') &&
                  (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar134[0x1f]) {
                auVar158._8_8_ = uStack_518;
                auVar158._0_8_ = local_520;
                auVar158._16_8_ = uStack_510;
                auVar158._24_8_ = uStack_508;
                auVar197 = ZEXT3264(auVar192);
              }
              else {
                auVar134 = vcmpps_avx(ZEXT1632(auVar140),ZEXT832(0) << 0x20,4);
                auVar104 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
                auVar17 = vpand_avx(auVar17,auVar104);
                auVar134 = vpmovsxwd_avx2(auVar17);
                auVar158._8_8_ = uStack_518;
                auVar158._0_8_ = local_520;
                auVar158._16_8_ = uStack_510;
                auVar158._24_8_ = uStack_508;
                auVar197 = ZEXT3264(auVar192);
                if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar134 >> 0x7f,0) != '\0') ||
                      (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0xbf,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar134[0x1f] < '\0') {
                  auVar151 = ZEXT1632(CONCAT412(fVar115 * auVar18._12_4_,
                                                CONCAT48(fVar114 * auVar18._8_4_,
                                                         CONCAT44(fVar138 * auVar18._4_4_,
                                                                  fVar139 * auVar18._0_4_))));
                  auVar73._28_4_ = SUB84(uStack_508,4);
                  auVar73._0_28_ =
                       ZEXT1628(CONCAT412(fVar115 * auVar105._12_4_,
                                          CONCAT48(fVar114 * auVar105._8_4_,
                                                   CONCAT44(fVar138 * auVar105._4_4_,
                                                            fVar139 * auVar105._0_4_))));
                  auVar188._8_4_ = 0x3f800000;
                  auVar188._0_8_ = 0x3f8000003f800000;
                  auVar188._12_4_ = 0x3f800000;
                  auVar188._16_4_ = 0x3f800000;
                  auVar188._20_4_ = 0x3f800000;
                  auVar188._24_4_ = 0x3f800000;
                  auVar188._28_4_ = 0x3f800000;
                  auVar202 = vsubps_avx(auVar188,auVar151);
                  local_5a0 = vblendvps_avx(auVar202,auVar151,auVar21);
                  auVar202 = vsubps_avx(auVar188,auVar73);
                  local_3a0 = vblendvps_avx(auVar202,auVar73,auVar21);
                  auVar197 = ZEXT3264(auVar113);
                  auVar158 = auVar134;
                }
              }
            }
            auVar205 = ZEXT3264(local_720);
            uVar94 = uVar94 & 0xffffffff;
            if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar158 >> 0x7f,0) == '\0') &&
                  (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar158 >> 0xbf,0) == '\0') &&
                (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar158[0x1f]) {
              auVar136 = ZEXT3264(local_5a0);
              auVar184 = ZEXT3264(CONCAT428(fStack_684,
                                            CONCAT424(fStack_688,
                                                      CONCAT420(fStack_68c,
                                                                CONCAT416(fStack_690,
                                                                          CONCAT412(fStack_694,
                                                                                    CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
              auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,CONCAT416(
                                                  fVar153,CONCAT412(fVar160,CONCAT48(fVar153,uVar101
                                                                                    )))))));
              auVar189 = ZEXT3264(local_6c0);
            }
            else {
              auVar134 = vsubps_avx(ZEXT1632(auVar14),auVar127);
              auVar14 = vfmadd213ps_fma(auVar134,local_5a0,auVar127);
              fVar139 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar74._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar139;
              auVar74._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar139;
              auVar74._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar139;
              auVar74._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar139;
              auVar74._16_4_ = fVar139 * 0.0;
              auVar74._20_4_ = fVar139 * 0.0;
              auVar74._24_4_ = fVar139 * 0.0;
              auVar74._28_4_ = fVar139;
              auVar113 = auVar197._0_32_;
              auVar134 = vcmpps_avx(auVar113,auVar74,6);
              auVar202 = auVar158 & auVar134;
              auVar184 = ZEXT3264(CONCAT428(fStack_684,
                                            CONCAT424(fStack_688,
                                                      CONCAT420(fStack_68c,
                                                                CONCAT416(fStack_690,
                                                                          CONCAT412(fStack_694,
                                                                                    CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
              auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,CONCAT416(
                                                  fVar153,CONCAT412(fVar160,CONCAT48(fVar153,uVar101
                                                                                    )))))));
              auVar189 = ZEXT3264(local_6c0);
              if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar202 >> 0x7f,0) == '\0') &&
                    (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar202 >> 0xbf,0) == '\0') &&
                  (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar202[0x1f]) {
                auVar136 = ZEXT3264(local_5a0);
              }
              else {
                auVar135._8_4_ = 0xbf800000;
                auVar135._0_8_ = 0xbf800000bf800000;
                auVar135._12_4_ = 0xbf800000;
                auVar135._16_4_ = 0xbf800000;
                auVar135._20_4_ = 0xbf800000;
                auVar135._24_4_ = 0xbf800000;
                auVar135._28_4_ = 0xbf800000;
                auVar152._8_4_ = 0x40000000;
                auVar152._0_8_ = 0x4000000040000000;
                auVar152._12_4_ = 0x40000000;
                auVar152._16_4_ = 0x40000000;
                auVar152._20_4_ = 0x40000000;
                auVar152._24_4_ = 0x40000000;
                auVar152._28_4_ = 0x40000000;
                auVar14 = vfmadd213ps_fma(local_3a0,auVar152,auVar135);
                local_260 = local_5a0;
                local_240 = ZEXT1632(auVar14);
                local_1f0 = local_680;
                uStack_1e8 = uStack_678;
                local_1e0 = local_660._0_8_;
                uStack_1d8 = local_660._8_8_;
                local_1d0 = local_670._0_8_;
                uStack_1c8 = local_670._8_8_;
                pGVar10 = (context->scene->geometries).items[local_728].ptr;
                auVar136 = ZEXT3264(local_5a0);
                local_3a0 = local_240;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar92 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar92 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar134 = vandps_avx(auVar134,auVar158);
                  fVar139 = (float)local_200;
                  local_180[0] = (fVar139 + local_5a0._0_4_ + 0.0) * local_120;
                  local_180[1] = (fVar139 + local_5a0._4_4_ + 1.0) * fStack_11c;
                  local_180[2] = (fVar139 + local_5a0._8_4_ + 2.0) * fStack_118;
                  local_180[3] = (fVar139 + local_5a0._12_4_ + 3.0) * fStack_114;
                  fStack_170 = (fVar139 + local_5a0._16_4_ + 4.0) * fStack_110;
                  fStack_16c = (fVar139 + local_5a0._20_4_ + 5.0) * fStack_10c;
                  fStack_168 = (fVar139 + local_5a0._24_4_ + 6.0) * fStack_108;
                  fStack_164 = fVar139 + local_5a0._28_4_ + 7.0;
                  local_3a0._0_8_ = auVar14._0_8_;
                  local_3a0._8_8_ = auVar14._8_8_;
                  local_160 = local_3a0._0_8_;
                  uStack_158 = local_3a0._8_8_;
                  uStack_150 = 0;
                  uStack_148 = 0;
                  local_140 = auVar113;
                  uVar95 = vmovmskps_avx(auVar134);
                  if (uVar95 == 0) {
                    bVar92 = 0;
LAB_0159e612:
                    auVar205 = ZEXT3264(local_720);
                    auVar136 = ZEXT3264(local_5a0);
                    auVar197 = ZEXT3264(auVar113);
                    auVar184 = ZEXT3264(CONCAT428(fStack_684,
                                                  CONCAT424(fStack_688,
                                                            CONCAT420(fStack_68c,
                                                                      CONCAT416(fStack_690,
                                                                                CONCAT412(fStack_694
                                                                                          ,CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
                    auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,
                                                  CONCAT416(fVar153,CONCAT412(fVar160,CONCAT48(
                                                  fVar153,uVar101)))))));
                    auVar189 = ZEXT3264(local_6c0);
                  }
                  else {
                    uVar94 = (ulong)(uVar95 & 0xff);
                    _local_700 = ZEXT1632(CONCAT88(auVar13._8_8_,uVar94));
                    lVar23 = 0;
                    for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
                      lVar23 = lVar23 + 1;
                    }
                    local_840 = ZEXT1632(CONCAT88(auVar15._8_8_,lVar23));
                    local_560 = ZEXT1632(*(undefined1 (*) [16])
                                          (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10))
                    ;
                    local_5c0 = ZEXT1632(CONCAT124(auVar16._4_12_,
                                                   *(undefined4 *)(ray + k * 4 + 0x80)));
                    _local_320 = *pauVar3;
                    _local_300 = *pauVar2;
                    local_220 = auVar113;
                    local_1fc = iVar9;
                    do {
                      local_400 = local_180[local_840._0_8_];
                      local_3f0 = *(undefined4 *)((long)&local_160 + local_840._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_140 + local_840._0_8_ * 4);
                      fVar114 = 1.0 - local_400;
                      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar114 * fVar114)),
                                                ZEXT416((uint)(local_400 * fVar114)),
                                                ZEXT416(0xc0000000));
                      auVar13 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar114)),
                                                ZEXT416((uint)(local_400 * local_400)),
                                                ZEXT416(0x40000000));
                      fVar139 = auVar13._0_4_ * 3.0;
                      fVar138 = local_400 * local_400 * 3.0;
                      auVar172._0_4_ = fVar138 * (float)local_530._0_4_;
                      auVar172._4_4_ = fVar138 * (float)local_530._4_4_;
                      auVar172._8_4_ = fVar138 * fStack_528;
                      auVar172._12_4_ = fVar138 * fStack_524;
                      auVar144._4_4_ = fVar139;
                      auVar144._0_4_ = fVar139;
                      auVar144._8_4_ = fVar139;
                      auVar144._12_4_ = fVar139;
                      auVar13 = vfmadd132ps_fma(auVar144,auVar172,local_670);
                      fVar139 = auVar14._0_4_ * 3.0;
                      auVar165._4_4_ = fVar139;
                      auVar165._0_4_ = fVar139;
                      auVar165._8_4_ = fVar139;
                      auVar165._12_4_ = fVar139;
                      auVar13 = vfmadd132ps_fma(auVar165,auVar13,local_660);
                      fVar139 = fVar114 * fVar114 * -3.0;
                      local_650.context = context->user;
                      auVar145._4_4_ = fVar139;
                      auVar145._0_4_ = fVar139;
                      auVar145._8_4_ = fVar139;
                      auVar145._12_4_ = fVar139;
                      auVar88._8_8_ = uStack_678;
                      auVar88._0_8_ = local_680;
                      auVar13 = vfmadd132ps_fma(auVar145,auVar13,auVar88);
                      local_430 = auVar13._0_4_;
                      local_420 = vshufps_avx(auVar13,auVar13,0x55);
                      local_410 = vshufps_avx(auVar13,auVar13,0xaa);
                      local_3e0 = CONCAT44(uStack_56c,local_570);
                      uStack_3d8 = CONCAT44(uStack_564,uStack_568);
                      local_3d0._4_4_ = uStack_28c;
                      local_3d0._0_4_ = local_290;
                      local_3d0._8_4_ = uStack_288;
                      local_3d0._12_4_ = uStack_284;
                      vpcmpeqd_avx2(ZEXT1632(local_3d0),ZEXT1632(local_3d0));
                      uStack_3bc = (local_650.context)->instID[0];
                      local_3c0 = uStack_3bc;
                      uStack_3b8 = uStack_3bc;
                      uStack_3b4 = uStack_3bc;
                      uStack_3b0 = (local_650.context)->instPrimID[0];
                      uStack_3ac = uStack_3b0;
                      uStack_3a8 = uStack_3b0;
                      uStack_3a4 = uStack_3b0;
                      local_740 = local_560._0_16_;
                      local_650.valid = (int *)local_740;
                      local_650.geometryUserPtr = pGVar10->userPtr;
                      local_650.hit = (RTCHitN *)&local_430;
                      local_650.N = 4;
                      local_650.ray = (RTCRayN *)ray;
                      uStack_42c = local_430;
                      uStack_428 = local_430;
                      uStack_424 = local_430;
                      fStack_3fc = local_400;
                      fStack_3f8 = local_400;
                      fStack_3f4 = local_400;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        (*pGVar10->occlusionFilterN)(&local_650);
                      }
                      if (local_740 == (undefined1  [16])0x0) {
                        auVar13 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar13 = auVar13 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar210 = ZEXT1664(auVar210._0_16_);
                          (*p_Var12)(&local_650);
                        }
                        auVar14 = vpcmpeqd_avx(local_740,_DAT_01f7aa10);
                        auVar13 = auVar14 ^ _DAT_01f7ae20;
                        auVar146._8_4_ = 0xff800000;
                        auVar146._0_8_ = 0xff800000ff800000;
                        auVar146._12_4_ = 0xff800000;
                        auVar14 = vblendvps_avx(auVar146,*(undefined1 (*) [16])
                                                          (local_650.ray + 0x80),auVar14);
                        *(undefined1 (*) [16])(local_650.ray + 0x80) = auVar14;
                      }
                      auVar126._8_8_ = 0x100000001;
                      auVar126._0_8_ = 0x100000001;
                      if ((auVar126 & auVar13) != (undefined1  [16])0x0) {
                        bVar92 = 1;
                        goto LAB_0159e612;
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_5c0._0_4_;
                      uVar97 = (ulong)local_700 ^ 1L << (local_840._0_8_ & 0x3f);
                      bVar92 = 0;
                      local_700 = (undefined1  [8])uVar97;
                      lVar23 = 0;
                      for (uVar94 = uVar97; (uVar94 & 1) == 0;
                          uVar94 = uVar94 >> 1 | 0x8000000000000000) {
                        lVar23 = lVar23 + 1;
                      }
                      local_840._0_8_ = lVar23;
                      auVar205 = ZEXT3264(local_720);
                      auVar136 = ZEXT3264(local_5a0);
                      auVar197 = ZEXT3264(auVar113);
                      auVar184 = ZEXT3264(CONCAT428(fStack_684,
                                                    CONCAT424(fStack_688,
                                                              CONCAT420(fStack_68c,
                                                                        CONCAT416(fStack_690,
                                                                                  CONCAT412(
                                                  fStack_694,
                                                  CONCAT48(fStack_698,CONCAT44(fStack_69c,local_6a0)
                                                          )))))));
                      auVar180 = ZEXT3264(CONCAT428(fVar160,CONCAT424(fVar153,CONCAT420(fVar160,
                                                  CONCAT416(fVar153,CONCAT412(fVar160,CONCAT48(
                                                  fVar153,uVar101)))))));
                      auVar189 = ZEXT3264(local_6c0);
                    } while (uVar97 != 0);
                  }
                }
                uVar94 = (ulong)CONCAT31(local_600._1_3_,local_600[0] | bVar92);
              }
            }
          }
          local_5a0 = auVar136._0_32_;
          uVar95 = (uint)uVar94;
          lVar99 = lVar99 + 8;
          auVar159 = ZEXT3264(local_6e0);
        } while ((int)lVar99 < iVar9);
      }
      bVar92 = (byte)uVar95;
      if ((uVar95 & 1) != 0) break;
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar106._4_4_ = uVar100;
      auVar106._0_4_ = uVar100;
      auVar106._8_4_ = uVar100;
      auVar106._12_4_ = uVar100;
      auVar13 = vcmpps_avx(local_280,auVar106,2);
      uVar95 = vmovmskps_avx(auVar13);
      uVar95 = (uint)uVar98 & uVar95;
    } while (uVar95 != 0);
  }
  return (bool)(bVar92 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }